

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::NewFrame(void)

{
  ImVector<ImGuiViewportP_*> *pIVar1;
  ImVector<ImGuiWindow_*> *this;
  ImGuiNextWindowData *pIVar2;
  ImVector<ImGuiStackLevelInfo> *pIVar3;
  ImVector<ImGuiContextHook> *this_00;
  ImVector<float> *this_01;
  ImVector<ImGuiTableTempData> *this_02;
  int *piVar4;
  short *psVar5;
  uint *puVar6;
  undefined8 uVar7;
  ImGuiNavLayer IVar8;
  ImFontAtlas *pIVar9;
  char *pcVar10;
  _func_bool_ImGuiViewport_ptr *p_Var11;
  _func_float_ImGuiViewport_ptr *p_Var12;
  _func_void_ImGuiViewport_ptr *p_Var13;
  ushort uVar14;
  undefined1 auVar15 [12];
  ImGuiScrollFlags scroll_flags;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [12];
  undefined1 auVar19 [16];
  ImGuiContext *pIVar20;
  undefined3 uVar21;
  bool bVar22;
  char cVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  int n_3;
  undefined4 extraout_EAX;
  ImGuiID IVar29;
  ImGuiKeyModFlags IVar30;
  ImGuiInputSource IVar31;
  ImGuiNavLayer IVar32;
  ImGuiDir IVar33;
  ImGuiContextHook *pIVar34;
  ImGuiViewportP **ppIVar35;
  ImGuiPlatformMonitor *pIVar36;
  ImVec2 *pIVar37;
  ImGuiWindow **ppIVar38;
  ImGuiViewportP *pIVar39;
  ImFont *font;
  ImGuiWindow *pIVar40;
  ImGuiPopupData *pIVar41;
  ImRect *pIVar42;
  float *pfVar43;
  ImGuiTable *table;
  ImGuiTableTempData *pIVar44;
  ImGuiStackLevelInfo *pIVar45;
  int i;
  uint uVar46;
  ImGuiID IVar47;
  ImGuiDir IVar48;
  ImGuiWindow *window;
  ImGuiWindow *parent;
  long lVar49;
  ulong uVar50;
  ImGuiWindow *pIVar51;
  int n_2;
  ImGuiViewportP *pIVar52;
  int n;
  int iVar53;
  bool *pbVar54;
  float *pfVar55;
  ulong uVar56;
  float *pfVar57;
  bool *pbVar58;
  long lVar59;
  int window_n;
  ImVector<ImGuiPlatformMonitor> *pIVar60;
  ImGuiContext *pIVar61;
  ImGuiViewportP *pIVar62;
  long lVar63;
  ImGuiContext *pIVar64;
  int i_1;
  long lVar65;
  byte bVar66;
  int iVar67;
  uint uVar68;
  int iVar69;
  float fVar70;
  undefined1 auVar77 [12];
  float fVar71;
  float fVar72;
  ImVec2 IVar73;
  ImVec2 IVar74;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  ImVec2 IVar75;
  ImVec2 IVar76;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar82;
  ImVec2 IVar83;
  float fVar88;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar92;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  ImRect IVar93;
  float local_b8;
  undefined4 local_a8;
  undefined4 uStack_a4;
  ImRect child_rect;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  ImRect local_58;
  ImVec2 local_40;
  ImGuiContext *local_38;
  undefined1 auVar78 [16];
  
  pIVar64 = GImGui;
  bVar66 = 0;
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                  ,0x1140,"void ImGui::NewFrame()");
  }
  this_00 = &GImGui->Hooks;
  iVar53 = (GImGui->Hooks).Size;
  while (0 < iVar53) {
    iVar53 = iVar53 + -1;
    pIVar34 = ImVector<ImGuiContextHook>::operator[](this_00,iVar53);
    if (*(int *)(pIVar34 + 4) == 7) {
      pIVar34 = ImVector<ImGuiContextHook>::operator[](this_00,iVar53);
      ImVector<ImGuiContextHook>::erase(this_00,pIVar34);
    }
  }
  CallContextHooks(pIVar64,ImGuiContextHookType_NewFramePre);
  pIVar64->ConfigFlagsLastFrame = pIVar64->ConfigFlagsCurrFrame;
  pIVar61 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                  ,0x2197,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  iVar53 = GImGui->FrameCount;
  if ((GImGui->IO).DeltaTime <= 0.0) {
    if (iVar53 != 0) {
      __assert_fail("(g.IO.DeltaTime > 0.0f || g.FrameCount == 0) && \"Need a positive DeltaTime!\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                    ,0x2198,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
LAB_00144fb0:
    iVar53 = 0;
    bVar22 = true;
  }
  else {
    if (iVar53 == 0) goto LAB_00144fb0;
    if (GImGui->FrameCountEnded != iVar53) {
      __assert_fail("(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                    ,0x2199,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    bVar22 = false;
  }
  if (((GImGui->IO).DisplaySize.x < 0.0) || ((GImGui->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                  ,0x219a,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  pIVar9 = (GImGui->IO).Fonts;
  if (((pIVar9->Fonts).Size < 1) || ((pIVar9->TexReady & 1U) == 0)) {
    __assert_fail("g.IO.Fonts->IsBuilt() && \"Font Atlas not built! Make sure you called ImGui_ImplXXXX_NewFrame() function for renderer backend, which should call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8()\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                  ,0x219b,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                  ,0x219c,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if ((GImGui->Style).CircleTessellationMaxError <= 0.0) {
    __assert_fail("g.Style.CircleTessellationMaxError > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                  ,0x219d,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  fVar70 = (GImGui->Style).Alpha;
  if ((fVar70 < 0.0) || (1.0 < fVar70)) {
    __assert_fail("g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                  ,0x219e,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->Style).WindowMinSize.x < 1.0) || ((GImGui->Style).WindowMinSize.y < 1.0)) {
    __assert_fail("g.Style.WindowMinSize.x >= 1.0f && g.Style.WindowMinSize.y >= 1.0f && \"Invalid style setting.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                  ,0x219f,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (2 < (GImGui->Style).WindowMenuButtonPosition + 1U) {
    __assert_fail("g.Style.WindowMenuButtonPosition == ImGuiDir_None || g.Style.WindowMenuButtonPosition == ImGuiDir_Left || g.Style.WindowMenuButtonPosition == ImGuiDir_Right"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                  ,0x21a0,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  lVar49 = 0x240;
  while (lVar49 != 0x2c5) {
    lVar59 = lVar49 * 4;
    lVar49 = lVar49 + 1;
    if (0x200 < *(int *)(&GImGui->Initialized + lVar59) + 1U) {
      __assert_fail("g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < ImGuiKey_LegacyNativeKey_END && \"io.KeyMap[] contains an out of bound value (need to be 0..511, or -1 for unmapped key)\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                    ,0x21a3,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
  }
  uVar46 = (GImGui->IO).ConfigFlags;
  if ((((uVar46 & 1) != 0) && ((GImGui->IO).BackendUsingLegacyKeyArrays == '\x01')) &&
     ((GImGui->IO).KeyMap[0x20c] == -1)) {
    __assert_fail("g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                  ,0x21a7,"void ImGui::ErrorCheckNewFrameSanityChecks()");
  }
  if (((GImGui->IO).ConfigWindowsResizeFromEdges == true) && (((GImGui->IO).BackendFlags & 2) == 0))
  {
    (GImGui->IO).ConfigWindowsResizeFromEdges = false;
  }
  if (iVar53 == 1) {
    if (((uVar46 & 0x40) != 0) && ((pIVar61->ConfigFlagsLastFrame & 0x40) == 0)) {
      __assert_fail("0 && \"Please set DockingEnable before the first call to NewFrame()! Otherwise you will lose your .ini settings!\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                    ,0x21b0,"void ImGui::ErrorCheckNewFrameSanityChecks()");
    }
    if ((uVar46 >> 10 & 1) != 0) {
      if ((pIVar61->ConfigFlagsLastFrame & 0x400) == 0) {
        __assert_fail("0 && \"Please set ViewportsEnable before the first call to NewFrame()! Otherwise you will lose your .ini settings!\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                      ,0x21b2,"void ImGui::ErrorCheckNewFrameSanityChecks()");
      }
LAB_0014513c:
      if ((~(pIVar61->IO).BackendFlags & 0x1400U) == 0) {
        if ((!bVar22) && (iVar53 != pIVar61->FrameCountPlatformEnded)) {
          __assert_fail("(g.FrameCount == 0 || g.FrameCount == g.FrameCountPlatformEnded) && \"Forgot to call UpdatePlatformWindows() in main loop after EndFrame()? Check examples/ applications for reference.\""
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                        ,0x21b9,"void ImGui::ErrorCheckNewFrameSanityChecks()");
        }
        if ((pIVar61->PlatformIO).Platform_CreateWindow == (_func_void_ImGuiViewport_ptr *)0x0) {
          __assert_fail("g.PlatformIO.Platform_CreateWindow != __null && \"Platform init didn\'t install handlers?\""
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                        ,0x21ba,"void ImGui::ErrorCheckNewFrameSanityChecks()");
        }
        if ((pIVar61->PlatformIO).Platform_DestroyWindow == (_func_void_ImGuiViewport_ptr *)0x0) {
          __assert_fail("g.PlatformIO.Platform_DestroyWindow != __null && \"Platform init didn\'t install handlers?\""
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                        ,0x21bb,"void ImGui::ErrorCheckNewFrameSanityChecks()");
        }
        if ((pIVar61->PlatformIO).Platform_GetWindowPos == (_func_ImVec2_ImGuiViewport_ptr *)0x0) {
          __assert_fail("g.PlatformIO.Platform_GetWindowPos != __null && \"Platform init didn\'t install handlers?\""
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                        ,0x21bc,"void ImGui::ErrorCheckNewFrameSanityChecks()");
        }
        if ((pIVar61->PlatformIO).Platform_SetWindowPos ==
            (_func_void_ImGuiViewport_ptr_ImVec2 *)0x0) {
          __assert_fail("g.PlatformIO.Platform_SetWindowPos != __null && \"Platform init didn\'t install handlers?\""
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                        ,0x21bd,"void ImGui::ErrorCheckNewFrameSanityChecks()");
        }
        if ((pIVar61->PlatformIO).Platform_GetWindowSize == (_func_ImVec2_ImGuiViewport_ptr *)0x0) {
          __assert_fail("g.PlatformIO.Platform_GetWindowSize != __null && \"Platform init didn\'t install handlers?\""
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                        ,0x21be,"void ImGui::ErrorCheckNewFrameSanityChecks()");
        }
        if ((pIVar61->PlatformIO).Platform_SetWindowSize ==
            (_func_void_ImGuiViewport_ptr_ImVec2 *)0x0) {
          __assert_fail("g.PlatformIO.Platform_SetWindowSize != __null && \"Platform init didn\'t install handlers?\""
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                        ,0x21bf,"void ImGui::ErrorCheckNewFrameSanityChecks()");
        }
        if ((pIVar61->PlatformIO).Monitors.Size < 1) {
          __assert_fail("g.PlatformIO.Monitors.Size > 0 && \"Platform init didn\'t setup Monitors list?\""
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                        ,0x21c0,"void ImGui::ErrorCheckNewFrameSanityChecks()");
        }
        ppIVar35 = ImVector<ImGuiViewportP_*>::operator[](&pIVar61->Viewports,0);
        if ((((*ppIVar35)->super_ImGuiViewport).PlatformUserData == (void *)0x0) &&
           (ppIVar35 = ImVector<ImGuiViewportP_*>::operator[](&pIVar61->Viewports,0),
           ((*ppIVar35)->super_ImGuiViewport).PlatformHandle == (void *)0x0)) {
          __assert_fail("(g.Viewports[0]->PlatformUserData != __null || g.Viewports[0]->PlatformHandle != __null) && \"Platform init didn\'t setup main viewport.\""
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                        ,0x21c1,"void ImGui::ErrorCheckNewFrameSanityChecks()");
        }
        if ((((pIVar61->IO).ConfigDockingTransparentPayload != false) &&
            (((pIVar61->IO).ConfigFlags & 0x40) != 0)) &&
           ((pIVar61->PlatformIO).Platform_SetWindowAlpha ==
            (_func_void_ImGuiViewport_ptr_float *)0x0)) {
          __assert_fail("g.PlatformIO.Platform_SetWindowAlpha != __null && \"Platform_SetWindowAlpha handler is required to use io.ConfigDockingTransparent!\""
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                        ,0x21c3,"void ImGui::ErrorCheckNewFrameSanityChecks()");
        }
      }
      else {
        (pIVar61->IO).ConfigFlags = uVar46 & 0xfffffbff;
      }
      pIVar60 = &(pIVar61->PlatformIO).Monitors;
      iVar53 = 0;
      while (pIVar61 = GImGui, iVar53 < pIVar60->Size) {
        pIVar36 = ImVector<ImGuiPlatformMonitor>::operator[](pIVar60,iVar53);
        fVar70 = (pIVar36->MainSize).x;
        if ((fVar70 <= 0.0) || (fVar82 = (pIVar36->MainSize).y, fVar82 <= 0.0)) {
          __assert_fail("mon.MainSize.x > 0.0f && mon.MainSize.y > 0.0f && \"Monitor main bounds not setup properly.\""
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                        ,0x21d0,"void ImGui::ErrorCheckNewFrameSanityChecks()");
        }
        fVar71 = (pIVar36->WorkPos).x;
        fVar72 = (pIVar36->MainPos).x;
        if (fVar71 < fVar72) {
LAB_001485e8:
          __assert_fail("ImRect(mon.MainPos, mon.MainPos + mon.MainSize).Contains(ImRect(mon.WorkPos, mon.WorkPos + mon.WorkSize)) && \"Monitor work bounds not setup properly. If you don\'t have work area information, just copy MainPos/MainSize into them.\""
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                        ,0x21d1,"void ImGui::ErrorCheckNewFrameSanityChecks()");
        }
        fVar92 = (pIVar36->MainPos).y;
        fVar88 = (pIVar36->WorkPos).y;
        uVar14 = -(ushort)(fVar92 <= fVar88);
        if ((uVar14 & 1) == 0) goto LAB_001485e8;
        iVar67 = -(uint)(fVar71 + (pIVar36->WorkSize).x <= fVar70 + fVar72);
        iVar69 = -(uint)(fVar88 + (pIVar36->WorkSize).y <= fVar82 + fVar92);
        auVar89._4_4_ = iVar69;
        auVar89._0_4_ = iVar67;
        auVar89._8_4_ = iVar69;
        auVar89._12_4_ = iVar69;
        auVar84._8_8_ = auVar89._8_8_;
        auVar84._4_4_ = iVar67;
        auVar84._0_4_ = iVar67;
        uVar46 = movmskpd((uint)uVar14,auVar84);
        if (((uVar46 & 1) == 0) || ((byte)((byte)uVar46 >> 1) == 0)) goto LAB_001485e8;
        iVar53 = iVar53 + 1;
        if ((pIVar36->DpiScale == 0.0) && (!NAN(pIVar36->DpiScale))) {
          __assert_fail("mon.DpiScale != 0.0f",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                        ,0x21d2,"void ImGui::ErrorCheckNewFrameSanityChecks()");
        }
      }
    }
  }
  else if ((uVar46 >> 10 & 1) != 0) goto LAB_0014513c;
  pIVar64->ConfigFlagsCurrFrame = (pIVar64->IO).ConfigFlags;
  if (pIVar61->SettingsLoaded == false) {
    if ((pIVar61->SettingsWindows).Buf.Size != 0) {
      __assert_fail("g.SettingsWindows.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                    ,0x2fb7,"void ImGui::UpdateSettings()");
    }
    pcVar10 = (pIVar61->IO).IniFilename;
    if (pcVar10 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar10);
    }
    pIVar61->SettingsLoaded = true;
  }
  if ((0.0 < pIVar61->SettingsDirtyTimer) &&
     (fVar70 = pIVar61->SettingsDirtyTimer - (pIVar61->IO).DeltaTime,
     pIVar61->SettingsDirtyTimer = fVar70, fVar70 <= 0.0)) {
    pcVar10 = (pIVar61->IO).IniFilename;
    if (pcVar10 == (char *)0x0) {
      (pIVar61->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar10);
    }
    pIVar61->SettingsDirtyTimer = 0.0;
  }
  pIVar64->Time = (double)(pIVar64->IO).DeltaTime + pIVar64->Time;
  pIVar64->WithinFrameScope = true;
  pIVar64->FrameCount = pIVar64->FrameCount + 1;
  pIVar64->TooltipOverrideCount = 0;
  pIVar64->WindowsActiveCount = 0;
  ImVector<unsigned_int>::resize(&pIVar64->MenusIdSubmittedThisFrame,0);
  fVar70 = (pIVar64->IO).DeltaTime;
  iVar53 = pIVar64->FramerateSecPerFrameIdx;
  pIVar64->FramerateSecPerFrameAccum =
       (fVar70 - pIVar64->FramerateSecPerFrame[iVar53]) + pIVar64->FramerateSecPerFrameAccum;
  pIVar64->FramerateSecPerFrame[iVar53] = fVar70;
  pIVar64->FramerateSecPerFrameIdx = (iVar53 + 1) % 0x78;
  iVar53 = 0x77;
  if (pIVar64->FramerateSecPerFrameCount < 0x77) {
    iVar53 = pIVar64->FramerateSecPerFrameCount;
  }
  pIVar64->FramerateSecPerFrameCount = iVar53 + 1;
  uVar46 = -(uint)(0.0 < pIVar64->FramerateSecPerFrameAccum);
  (pIVar64->IO).Framerate =
       (float)(~uVar46 & 0x7f7fffff |
              (uint)(1.0 / (pIVar64->FramerateSecPerFrameAccum / (float)(iVar53 + 1))) & uVar46);
  pIVar61 = GImGui;
  iVar53 = (GImGui->Viewports).Size;
  if (iVar53 < (GImGui->PlatformIO).Viewports.Size) {
    __assert_fail("g.PlatformIO.Viewports.Size <= g.Viewports.Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                  ,0x31c5,"void ImGui::UpdateViewportsNewFrame()");
  }
  pIVar1 = &GImGui->Viewports;
  uVar46 = GImGui->ConfigFlagsCurrFrame;
  if ((uVar46 >> 10 & 1) != 0) {
    for (iVar67 = 0; iVar67 < iVar53; iVar67 = iVar67 + 1) {
      ppIVar35 = ImVector<ImGuiViewportP_*>::operator[](pIVar1,iVar67);
      p_Var11 = (pIVar61->PlatformIO).Platform_GetWindowMinimized;
      if ((p_Var11 != (_func_bool_ImGuiViewport_ptr *)0x0) &&
         (pIVar39 = *ppIVar35, pIVar39->PlatformWindowCreated == true)) {
        bVar22 = (*p_Var11)(&pIVar39->super_ImGuiViewport);
        (pIVar39->super_ImGuiViewport).Flags =
             (uint)bVar22 << 10 | (pIVar39->super_ImGuiViewport).Flags & 0xfffffbffU;
      }
      iVar53 = pIVar1->Size;
    }
  }
  ppIVar35 = ImVector<ImGuiViewportP_*>::operator[](pIVar1,0);
  pIVar39 = *ppIVar35;
  if ((pIVar39->super_ImGuiViewport).ID != 0x11111111) {
    __assert_fail("main_viewport->ID == IMGUI_VIEWPORT_DEFAULT_ID",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                  ,0x31dd,"void ImGui::UpdateViewportsNewFrame()");
  }
  local_a8 = SUB84(pIVar39,0);
  uStack_a4 = (undefined4)((ulong)pIVar39 >> 0x20);
  if (pIVar39->Window != (ImGuiWindow *)0x0) {
    __assert_fail("main_viewport->Window == __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                  ,0x31de,"void ImGui::UpdateViewportsNewFrame()");
  }
  local_38 = pIVar64;
  if ((uVar46 >> 10 & 1) == 0) {
    auVar17._8_8_ = 0;
    auVar17._0_4_ = local_58.Max.x;
    auVar17._4_4_ = local_58.Max.y;
    local_58 = (ImRect)(auVar17 << 0x40);
    local_40 = (pIVar61->IO).DisplaySize;
  }
  else {
    local_58.Min = (*(pIVar61->PlatformIO).Platform_GetWindowPos)(&pIVar39->super_ImGuiViewport);
    local_40 = (pIVar61->IO).DisplaySize;
    if (((pIVar39->super_ImGuiViewport).Flags & 0x400) != 0) {
      local_58.Min = (pIVar39->super_ImGuiViewport).Pos;
      local_40 = (pIVar39->super_ImGuiViewport).Size;
    }
  }
  iVar53 = 0;
  AddUpdateViewport((ImGuiWindow *)0x0,0x11111111,&local_58.Min,&local_40,0x1004);
  pIVar61->CurrentDpiScale = 0.0;
  pIVar60 = &(pIVar61->PlatformIO).Monitors;
  pIVar61->CurrentViewport = (ImGuiViewportP *)0x0;
  pIVar61->MouseViewport = (ImGuiViewportP *)0x0;
  while (pIVar64 = local_38, iVar53 < pIVar1->Size) {
    pIVar37 = (ImVec2 *)ImVector<ImGuiViewportP_*>::operator[](pIVar1,iVar53);
    IVar74 = *pIVar37;
    *(int *)((long)IVar74 + 0x5c) = iVar53;
    pIVar64 = GImGui;
    if ((iVar53 == 0) || (pIVar61->FrameCount + -2 <= *(int *)((long)IVar74 + 0x60))) {
      bVar22 = *(bool *)((long)IVar74 + 0x7e);
      if (((uVar46 >> 10 & 1) != 0) && (((*(byte *)((long)IVar74 + 5) & 4) == 0 & bVar22) == 1)) {
        if (*(bool *)((long)IVar74 + 0x58) == true) {
          IVar73 = (*(pIVar61->PlatformIO).Platform_GetWindowPos)((ImGuiViewport *)IVar74);
          *(ImVec2 *)((long)IVar74 + 0xf8) = IVar73;
          *(ImVec2 *)((long)IVar74 + 8) = IVar73;
        }
        if (*(bool *)((long)IVar74 + 0x59) == true) {
          IVar73 = (*(pIVar61->PlatformIO).Platform_GetWindowSize)((ImGuiViewport *)IVar74);
          *(ImVec2 *)((long)IVar74 + 0x100) = IVar73;
          *(ImVec2 *)((long)IVar74 + 0x10) = IVar73;
        }
      }
      UpdateViewportPlatformMonitor((ImGuiViewportP *)IVar74);
      *(ImVec2 *)((long)IVar74 + 0x110) = *(ImVec2 *)((long)IVar74 + 0x120);
      *(ImVec2 *)((long)IVar74 + 0x118) = *(ImVec2 *)((long)IVar74 + 0x128);
      ((ImVec2 *)((long)IVar74 + 0x120))->x = 0.0;
      ((ImVec2 *)((long)IVar74 + 0x120))->y = 0.0;
      ((ImVec2 *)((long)IVar74 + 0x128))->x = 0.0;
      ((ImVec2 *)((long)IVar74 + 0x128))->y = 0.0;
      ImGuiViewportP::UpdateWorkRect((ImGuiViewportP *)IVar74);
      *(float *)((long)IVar74 + 0x74) = 1.0;
      if ((*(byte *)((long)IVar74 + 5) & 0x10) != 0) {
        IVar73 = *(ImVec2 *)((long)IVar74 + 8);
        IVar75 = *(ImVec2 *)((long)IVar74 + 0x6c);
        iVar67 = -(uint)(IVar73.x - IVar75.x != 0.0);
        iVar69 = -(uint)(IVar73.y - IVar75.y != 0.0);
        auVar79._4_4_ = iVar69;
        auVar79._0_4_ = iVar67;
        auVar79._8_4_ = iVar69;
        auVar79._12_4_ = iVar69;
        auVar78._8_8_ = auVar79._8_8_;
        auVar78._4_4_ = iVar67;
        auVar78._0_4_ = iVar67;
        iVar67 = movmskpd(extraout_EAX,auVar78);
        if (iVar67 != 0) {
          TranslateWindowsInViewport
                    ((ImGuiViewportP *)IVar74,(ImVec2 *)((long)IVar74 + 0x6c),
                     (ImVec2 *)((long)IVar74 + 8));
        }
      }
      p_Var12 = (pIVar61->PlatformIO).Platform_GetWindowDpiScale;
      if ((p_Var12 == (_func_float_ImGuiViewport_ptr *)0x0) || (bVar22 == false)) {
        if (*(short *)((long)IVar74 + 0x7c) == -1) {
          uVar68 = -(uint)(*(float *)((long)IVar74 + 0x28) != 0.0);
          fVar70 = (float)(~uVar68 & 0x3f800000 | (uint)*(float *)((long)IVar74 + 0x28) & uVar68);
        }
        else {
          pIVar36 = ImVector<ImGuiPlatformMonitor>::operator[]
                              (pIVar60,(int)*(short *)((long)IVar74 + 0x7c));
          fVar70 = pIVar36->DpiScale;
        }
      }
      else {
        fVar70 = (*p_Var12)((ImGuiViewport *)IVar74);
      }
      fVar82 = *(float *)((long)IVar74 + 0x28);
      if ((fVar82 != 0.0) || (NAN(fVar82))) {
        if (((fVar70 != fVar82) || (NAN(fVar70) || NAN(fVar82))) &&
           (((pIVar61->IO).ConfigFlags & 0x4000) != 0)) {
          ScaleWindowsInViewport((ImGuiViewportP *)IVar74,fVar70 / fVar82);
        }
      }
      *(float *)((long)IVar74 + 0x28) = fVar70;
      iVar53 = iVar53 + 1;
    }
    else {
      this = &GImGui->Windows;
      for (iVar67 = 0; iVar67 < this->Size; iVar67 = iVar67 + 1) {
        ppIVar38 = ImVector<ImGuiWindow_*>::operator[](this,iVar67);
        pIVar40 = *ppIVar38;
        if ((ImVec2)pIVar40->Viewport == IVar74) {
          pIVar40->Viewport = (ImGuiViewportP *)0x0;
          pIVar40->ViewportOwned = false;
        }
      }
      if ((ImVec2)pIVar64->MouseLastHoveredViewport == IVar74) {
        pIVar64->MouseLastHoveredViewport = (ImGuiViewportP *)0x0;
      }
      DestroyPlatformWindow((ImGuiViewportP *)IVar74);
      child_rect.Min = IVar74;
      bVar22 = ImVector<ImGuiViewport_*>::contains
                         (&(pIVar64->PlatformIO).Viewports,(ImGuiViewport **)&child_rect);
      if (bVar22) {
        __assert_fail("g.PlatformIO.Viewports.contains(viewport) == false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                      ,0x32d7,"void ImGui::DestroyViewport(ImGuiViewportP *)");
      }
      pIVar37 = (ImVec2 *)
                ImVector<ImGuiViewportP_*>::operator[]
                          (&pIVar64->Viewports,*(int *)((long)IVar74 + 0x5c));
      if (*pIVar37 != IVar74) {
        __assert_fail("g.Viewports[viewport->Idx] == viewport",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                      ,0x32d8,"void ImGui::DestroyViewport(ImGuiViewportP *)");
      }
      ImVector<ImGuiViewportP_*>::erase
                (&pIVar64->Viewports,(pIVar64->Viewports).Data + *(int *)((long)IVar74 + 0x5c));
      IM_DELETE<ImGuiViewportP>((ImGuiViewportP *)IVar74);
    }
  }
  if (pIVar60->Size == 0) {
    (pIVar61->FallbackMonitor).MainPos = (pIVar39->super_ImGuiViewport).Pos;
    (pIVar61->FallbackMonitor).MainSize = (pIVar39->super_ImGuiViewport).Size;
    (pIVar61->FallbackMonitor).WorkPos = (pIVar39->super_ImGuiViewport).WorkPos;
    (pIVar61->FallbackMonitor).WorkSize = (pIVar39->super_ImGuiViewport).WorkSize;
    (pIVar61->FallbackMonitor).DpiScale = (pIVar39->super_ImGuiViewport).DpiScale;
  }
  if ((uVar46 >> 10 & 1) == 0) {
LAB_00145851:
    pIVar61->MouseViewport = (ImGuiViewportP *)CONCAT44(uStack_a4,local_a8);
  }
  else {
    if (((pIVar61->IO).BackendFlags & 0x800) == 0) {
LAB_00145868:
      pIVar39 = FindHoveredViewportFromPlatformWindowStack(&(pIVar61->IO).MousePos);
      if (pIVar39 == (ImGuiViewportP *)0x0) goto LAB_001458a9;
LAB_00145895:
      pIVar61->MouseLastHoveredViewport = pIVar39;
      bVar22 = false;
      pIVar52 = pIVar39;
    }
    else {
      IVar47 = (pIVar61->IO).MouseHoveredViewport;
      if ((IVar47 != 0) &&
         (pIVar39 = (ImGuiViewportP *)FindViewportByID(IVar47), pIVar39 != (ImGuiViewportP *)0x0)) {
        if (((pIVar39->super_ImGuiViewport).Flags & 0x80) != 0) goto LAB_00145868;
        goto LAB_00145895;
      }
LAB_001458a9:
      pIVar39 = pIVar61->MouseLastHoveredViewport;
      bVar22 = true;
      if (pIVar39 == (ImGuiViewportP *)0x0) {
        ppIVar35 = ImVector<ImGuiViewportP_*>::operator[](pIVar1,0);
        pIVar39 = *ppIVar35;
        pIVar61->MouseLastHoveredViewport = pIVar39;
        pIVar52 = (ImGuiViewportP *)0x0;
      }
      else {
        pIVar52 = (ImGuiViewportP *)0x0;
      }
    }
    if ((pIVar61->MovingWindow == (ImGuiWindow *)0x0) ||
       (pIVar62 = pIVar61->MovingWindow->Viewport, pIVar62 == (ImGuiViewportP *)0x0)) {
      pIVar62 = pIVar39;
    }
    if (pIVar61->DragDropActive == false) {
      pIVar39 = pIVar52;
    }
    if (!bVar22) {
      pIVar39 = pIVar52;
    }
    local_a8 = SUB84(pIVar39,0);
    uStack_a4 = (undefined4)((ulong)pIVar39 >> 0x20);
    pIVar61->MouseViewport = pIVar62;
    if ((pIVar61->DragDropActive == false) && (pIVar61->ActiveId != 0)) {
      bVar22 = IsAnyMouseDown();
      if ((pIVar52 != (ImGuiViewportP *)0x0) && (!bVar22)) {
joined_r0x00145948:
        if ((pIVar52 != pIVar62) && (((pIVar39->super_ImGuiViewport).Flags & 0x80) == 0))
        goto LAB_00145851;
      }
    }
    else {
      pIVar52 = pIVar39;
      if (pIVar39 != (ImGuiViewportP *)0x0) goto joined_r0x00145948;
    }
    if (pIVar62 == (ImGuiViewportP *)0x0) {
      __assert_fail("g.MouseViewport != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                    ,0x326d,"void ImGui::UpdateViewportsNewFrame()");
    }
  }
  ((pIVar64->IO).Fonts)->Locked = true;
  font = GetDefaultFont();
  SetCurrentFont(font);
  if (pIVar64->Font->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.Font->IsLoaded()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                  ,0x1167,"void ImGui::NewFrame()");
  }
  pIVar1 = &pIVar64->Viewports;
  fVar70 = 3.4028235e+38;
  fVar82 = 3.4028235e+38;
  fVar71 = -3.4028235e+38;
  fVar72 = -3.4028235e+38;
  for (iVar53 = 0; iVar53 < pIVar1->Size; iVar53 = iVar53 + 1) {
    ppIVar35 = ImVector<ImGuiViewportP_*>::operator[](pIVar1,iVar53);
    IVar93 = ImGuiViewportP::GetMainRect(*ppIVar35);
    fVar88 = IVar93.Min.x;
    if (fVar70 <= IVar93.Min.x) {
      fVar88 = fVar70;
    }
    fVar70 = IVar93.Min.y;
    if (fVar82 <= IVar93.Min.y) {
      fVar70 = fVar82;
    }
    if (fVar71 < IVar93.Max.x) {
      auVar77._4_4_ = fVar70;
      auVar77._0_4_ = fVar88;
      auVar77._8_4_ = IVar93.Max.x;
    }
    else {
      auVar77._4_4_ = fVar70;
      auVar77._0_4_ = fVar88;
      auVar77._8_4_ = fVar71;
    }
    fVar70 = auVar77._0_4_;
    fVar82 = auVar77._4_4_;
    fVar71 = auVar77._8_4_;
    if (fVar72 < IVar93.Max.y) {
      fVar72 = IVar93.Max.y;
    }
  }
  (pIVar64->DrawListSharedData).ClipRectFullscreen.x = fVar70;
  (pIVar64->DrawListSharedData).ClipRectFullscreen.y = fVar82;
  (pIVar64->DrawListSharedData).ClipRectFullscreen.z = fVar71;
  (pIVar64->DrawListSharedData).ClipRectFullscreen.w = fVar72;
  fVar70 = (pIVar64->Style).CircleTessellationMaxError;
  (pIVar64->DrawListSharedData).CurveTessellationTol = (pIVar64->Style).CurveTessellationTol;
  ImDrawListSharedData::SetCircleTessellationMaxError(&pIVar64->DrawListSharedData,fVar70);
  bVar22 = (pIVar64->Style).AntiAliasedLines;
  uVar46 = (uint)bVar22;
  (pIVar64->DrawListSharedData).InitialFlags = (uint)bVar22;
  if (((pIVar64->Style).AntiAliasedLinesUseTex != false) &&
     ((pIVar64->Font->ContainerAtlas->Flags & 4) == 0)) {
    uVar46 = bVar22 | 2;
    (pIVar64->DrawListSharedData).InitialFlags = uVar46;
  }
  if ((pIVar64->Style).AntiAliasedFill == true) {
    uVar46 = uVar46 | 4;
    (pIVar64->DrawListSharedData).InitialFlags = uVar46;
  }
  if (((pIVar64->IO).BackendFlags & 8) != 0) {
    (pIVar64->DrawListSharedData).InitialFlags = uVar46 | 8;
  }
  for (iVar53 = 0; iVar53 < pIVar1->Size; iVar53 = iVar53 + 1) {
    ppIVar35 = ImVector<ImGuiViewportP_*>::operator[](pIVar1,iVar53);
    pIVar39 = *ppIVar35;
    (pIVar39->super_ImGuiViewport).DrawData = (ImDrawData *)0x0;
    (pIVar39->DrawDataP).DisplaySize.x = 0.0;
    (pIVar39->DrawDataP).DisplaySize.y = 0.0;
    (pIVar39->DrawDataP).FramebufferScale.x = 0.0;
    (pIVar39->DrawDataP).FramebufferScale.y = 0.0;
    (pIVar39->DrawDataP).CmdLists = (ImDrawList **)0x0;
    (pIVar39->DrawDataP).DisplayPos.x = 0.0;
    (pIVar39->DrawDataP).DisplayPos.y = 0.0;
    (pIVar39->DrawDataP).Valid = false;
    *(undefined3 *)&(pIVar39->DrawDataP).field_0x1 = 0;
    (pIVar39->DrawDataP).CmdListsCount = 0;
    (pIVar39->DrawDataP).TotalIdxCount = 0;
    (pIVar39->DrawDataP).TotalVtxCount = 0;
    (pIVar39->DrawDataP).OwnerViewport = (ImGuiViewport *)0x0;
  }
  if ((pIVar64->DragDropActive != false) &&
     (IVar47 = (pIVar64->DragDropPayload).SourceId, IVar47 == pIVar64->ActiveId)) {
    KeepAliveID(IVar47);
  }
  if (pIVar64->HoveredIdPreviousFrame == 0) {
    IVar47 = pIVar64->HoveredId;
    pIVar64->HoveredIdTimer = 0.0;
    pIVar64->HoveredIdNotActiveTimer = 0.0;
    if (IVar47 == 0) goto LAB_00145b8b;
LAB_00145b5c:
    fVar70 = (pIVar64->IO).DeltaTime;
    pIVar64->HoveredIdTimer = pIVar64->HoveredIdTimer + fVar70;
    IVar29 = IVar47;
    if (pIVar64->ActiveId != IVar47) {
      pIVar64->HoveredIdNotActiveTimer = fVar70 + pIVar64->HoveredIdNotActiveTimer;
      IVar29 = pIVar64->ActiveId;
    }
  }
  else {
    IVar47 = pIVar64->HoveredId;
    if (IVar47 != 0) {
      if (pIVar64->ActiveId == IVar47) {
        pIVar64->HoveredIdNotActiveTimer = 0.0;
      }
      goto LAB_00145b5c;
    }
LAB_00145b8b:
    IVar47 = 0;
    IVar29 = pIVar64->ActiveId;
  }
  pIVar64->HoveredIdPreviousFrame = IVar47;
  pIVar64->HoveredIdPreviousFrameUsingMouseWheel = pIVar64->HoveredIdUsingMouseWheel;
  pIVar64->HoveredId = 0;
  pIVar64->HoveredIdAllowOverlap = false;
  pIVar64->HoveredIdUsingMouseWheel = false;
  pIVar64->HoveredIdDisabled = false;
  if (((pIVar64->ActiveIdIsAlive != IVar29) && (IVar29 != 0)) &&
     (pIVar64->ActiveIdPreviousFrame == IVar29)) {
    ClearActiveID();
    IVar29 = pIVar64->ActiveId;
  }
  fVar70 = (pIVar64->IO).DeltaTime;
  if (IVar29 != 0) {
    pIVar64->ActiveIdTimer = pIVar64->ActiveIdTimer + fVar70;
  }
  pIVar64->LastActiveIdTimer = fVar70 + pIVar64->LastActiveIdTimer;
  pIVar64->ActiveIdPreviousFrame = IVar29;
  pIVar64->ActiveIdPreviousFrameWindow = pIVar64->ActiveIdWindow;
  pIVar64->ActiveIdPreviousFrameHasBeenEditedBefore = pIVar64->ActiveIdHasBeenEditedBefore;
  pIVar64->ActiveIdIsAlive = 0;
  pIVar64->ActiveIdHasBeenEditedThisFrame = false;
  pIVar64->ActiveIdPreviousFrameIsAlive = false;
  pIVar64->ActiveIdIsJustActivated = false;
  if (pIVar64->TempInputId == 0) {
LAB_00145c9f:
    if (IVar29 == 0) {
      (pIVar64->ActiveIdUsingKeyInputMask).Storage[1] = 0;
      (pIVar64->ActiveIdUsingKeyInputMask).Storage[2] = 0;
      (pIVar64->ActiveIdUsingKeyInputMask).Storage[3] = 0;
      (pIVar64->ActiveIdUsingKeyInputMask).Storage[4] = 0;
      pIVar64->ActiveIdUsingNavDirMask = 0;
      pIVar64->ActiveIdUsingNavInputMask = 0;
      (pIVar64->ActiveIdUsingKeyInputMask).Storage[0] = 0;
      (pIVar64->ActiveIdUsingKeyInputMask).Storage[1] = 0;
    }
  }
  else if (IVar29 != pIVar64->TempInputId) {
    pIVar64->TempInputId = 0;
    goto LAB_00145c9f;
  }
  pIVar64->DragDropAcceptIdPrev = pIVar64->DragDropAcceptIdCurr;
  pIVar64->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar64->DragDropAcceptIdCurr = 0;
  pIVar64->DragDropWithinSource = false;
  pIVar64->DragDropWithinTarget = false;
  pIVar64->DragDropHoldJustPressedId = 0;
  ImVector<ImGuiInputEvent>::resize(&pIVar64->InputEventsTrail,0);
  UpdateInputEvents((pIVar64->IO).ConfigInputTrickleEventQueue);
  pIVar64 = GImGui;
  cVar23 = (GImGui->IO).BackendUsingLegacyKeyArrays;
  if (cVar23 == '\0') {
    for (lVar49 = 0; lVar49 != 0x200; lVar49 = lVar49 + 1) {
      if (((pIVar64->IO).KeysDown[lVar49] != false) &&
         (bVar22 = IsKeyDown((ImGuiKey)lVar49), !bVar22)) {
        __assert_fail("(io.KeysDown[n] == false || IsKeyDown(n)) && \"Backend needs to either only use io.AddKeyEvent(), either only fill legacy io.KeysDown[] + io.KeyMap[]. Not both!\""
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                      ,0x100d,"void ImGui::UpdateKeyboardInputs()");
      }
    }
  }
  else {
    if (GImGui->FrameCount == 0) {
      lVar49 = 0;
      while (lVar49 != 0x200) {
        piVar4 = (GImGui->IO).KeyMap + lVar49;
        lVar49 = lVar49 + 1;
        if (*piVar4 != -1) {
          __assert_fail("g.IO.KeyMap[n] == -1 && \"Backend is not allowed to write to io.KeyMap[0..511]!\""
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                        ,0x1013,"void ImGui::UpdateKeyboardInputs()");
        }
      }
    }
    for (lVar49 = 0; lVar49 != 0x85; lVar49 = lVar49 + 1) {
      uVar46 = (pIVar64->IO).KeyMap[lVar49 + 0x200];
      if ((ulong)uVar46 != 0xffffffff) {
        if (0x1ff < uVar46) {
          __assert_fail("IsLegacyKey((ImGuiKey)io.KeyMap[n])",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                        ,0x1019,"void ImGui::UpdateKeyboardInputs()");
        }
        (pIVar64->IO).KeyMap[uVar46] = (int)lVar49 + 0x200;
      }
    }
    for (uVar50 = 0; uVar50 != 0x200; uVar50 = uVar50 + 1) {
      bVar22 = (pIVar64->IO).KeysDown[uVar50];
      if ((cVar23 == '\x01' | bVar22) == 1) {
        uVar46 = (pIVar64->IO).KeyMap[uVar50];
        if (0x84 < uVar46 - 0x200 && uVar46 != 0xffffffff) {
          __assert_fail("io.KeyMap[n] == -1 || IsNamedKey(key)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                        ,0x1022,"void ImGui::UpdateKeyboardInputs()");
        }
        uVar56 = uVar50 & 0xffffffff;
        if (uVar46 != 0xffffffff) {
          uVar56 = (ulong)uVar46;
        }
        (pIVar64->IO).KeysData[(int)uVar56].Down = bVar22;
        if (uVar50 != uVar56) {
          (pIVar64->IO).KeysDown[(int)uVar56] = (pIVar64->IO).KeysDown[uVar50];
        }
        (pIVar64->IO).BackendUsingLegacyKeyArrays = '\x01';
        cVar23 = '\x01';
      }
    }
    if (cVar23 == '\x01') {
      bVar22 = (pIVar64->IO).KeyShift;
      (pIVar64->IO).KeysData[0x281].Down = (pIVar64->IO).KeyCtrl;
      (pIVar64->IO).KeysData[0x282].Down = bVar22;
      (pIVar64->IO).KeysData[0x283].Down = (pIVar64->IO).KeyAlt;
      (pIVar64->IO).KeysData[0x284].Down = (pIVar64->IO).KeySuper;
    }
  }
  IVar30 = GetMergedKeyModFlags();
  (pIVar64->IO).KeyMods = IVar30;
  if (((pIVar64->IO).BackendFlags & 1) == 0) {
    for (lVar49 = 0; lVar49 != 0x180; lVar49 = lVar49 + 0x10) {
      (&(pIVar64->IO).KeysData[0x269].Down)[lVar49] = false;
      *(undefined4 *)((long)&(pIVar64->IO).KeysData[0x269].AnalogValue + lVar49) = 0;
    }
  }
  for (lVar49 = 0xe18; pIVar61 = GImGui, lVar49 != 0x3668; lVar49 = lVar49 + 0x10) {
    fVar70 = *(float *)((long)pIVar64 + lVar49 + -4);
    *(float *)(&pIVar64->Initialized + lVar49) = fVar70;
    fVar82 = -1.0;
    if ((*(char *)((long)pIVar64 + lVar49 + -8) == '\x01') && (fVar82 = 0.0, 0.0 <= fVar70)) {
      fVar82 = fVar70 + (pIVar64->IO).DeltaTime;
    }
    *(float *)((long)pIVar64 + lVar49 + -4) = fVar82;
  }
  (GImGui->IO).WantSetMousePos = false;
  uVar46 = (pIVar61->IO).ConfigFlags;
  if (((uVar46 & 2) == 0) || (((pIVar61->IO).BackendFlags & 1) == 0)) {
    bVar22 = false;
  }
  else {
    bVar22 = true;
    if ((pIVar61->IO).BackendUsingLegacyNavInputArray == false) {
      lVar49 = 0;
      while (lVar49 != 0x14) {
        fVar70 = (pIVar61->IO).NavInputs[lVar49];
        lVar49 = lVar49 + 1;
        if ((fVar70 != 0.0) || (NAN(fVar70))) {
          __assert_fail("io.NavInputs[n] == 0.0f && \"Backend needs to either only use io.AddKeyEvent()/io.AddKeyAnalogEvent(), either only fill legacy io.NavInputs[]. Not both!\""
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                        ,0x2a08,"void ImGui::NavUpdate()");
        }
      }
      fVar70 = (pIVar61->IO).KeysData[0x26c].AnalogValue;
      (pIVar61->IO).NavInputs[0] = fVar70;
      if (0.0 < fVar70) {
        pIVar61->NavInputSource = ImGuiInputSource_Gamepad;
      }
      fVar70 = (pIVar61->IO).KeysData[0x26e].AnalogValue;
      (pIVar61->IO).NavInputs[1] = fVar70;
      if (0.0 < fVar70) {
        pIVar61->NavInputSource = ImGuiInputSource_Gamepad;
      }
      fVar70 = (pIVar61->IO).KeysData[0x26d].AnalogValue;
      (pIVar61->IO).NavInputs[3] = fVar70;
      if (0.0 < fVar70) {
        pIVar61->NavInputSource = ImGuiInputSource_Gamepad;
      }
      fVar70 = (pIVar61->IO).KeysData[0x26b].AnalogValue;
      (pIVar61->IO).NavInputs[2] = fVar70;
      if (0.0 < fVar70) {
        pIVar61->NavInputSource = ImGuiInputSource_Gamepad;
      }
      fVar70 = (pIVar61->IO).KeysData[0x271].AnalogValue;
      (pIVar61->IO).NavInputs[4] = fVar70;
      if (0.0 < fVar70) {
        pIVar61->NavInputSource = ImGuiInputSource_Gamepad;
      }
      fVar70 = (pIVar61->IO).KeysData[0x272].AnalogValue;
      (pIVar61->IO).NavInputs[5] = fVar70;
      if (0.0 < fVar70) {
        pIVar61->NavInputSource = ImGuiInputSource_Gamepad;
      }
      fVar70 = (pIVar61->IO).KeysData[0x26f].AnalogValue;
      (pIVar61->IO).NavInputs[6] = fVar70;
      if (0.0 < fVar70) {
        pIVar61->NavInputSource = ImGuiInputSource_Gamepad;
      }
      fVar70 = (pIVar61->IO).KeysData[0x270].AnalogValue;
      (pIVar61->IO).NavInputs[7] = fVar70;
      if (0.0 < fVar70) {
        pIVar61->NavInputSource = ImGuiInputSource_Gamepad;
      }
      fVar70 = (pIVar61->IO).KeysData[0x273].AnalogValue;
      fVar82 = (pIVar61->IO).KeysData[0x274].AnalogValue;
      (pIVar61->IO).NavInputs[0xc] = fVar70;
      (pIVar61->IO).NavInputs[0xd] = fVar82;
      (pIVar61->IO).NavInputs[0xe] = fVar70;
      (pIVar61->IO).NavInputs[0xf] = fVar82;
      (pIVar61->IO).NavInputs[8] = (pIVar61->IO).KeysData[0x27b].AnalogValue;
      (pIVar61->IO).NavInputs[9] = (pIVar61->IO).KeysData[0x27c].AnalogValue;
      (pIVar61->IO).NavInputs[10] = (pIVar61->IO).KeysData[0x279].AnalogValue;
      (pIVar61->IO).NavInputs[0xb] = (pIVar61->IO).KeysData[0x27a].AnalogValue;
    }
  }
  if ((uVar46 & 1) != 0) {
    bVar24 = IsKeyDown(0x20c);
    if (bVar24) {
      (pIVar61->IO).NavInputs[0] = 1.0;
      pIVar61->NavInputSource = ImGuiInputSource_Keyboard;
    }
    bVar24 = IsKeyDown(0x20d);
    if (bVar24) {
      (pIVar61->IO).NavInputs[2] = 1.0;
      pIVar61->NavInputSource = ImGuiInputSource_Keyboard;
    }
    bVar24 = IsKeyDown(0x20e);
    if (bVar24) {
      (pIVar61->IO).NavInputs[1] = 1.0;
      pIVar61->NavInputSource = ImGuiInputSource_Keyboard;
    }
    bVar24 = IsKeyDown(0x201);
    if (bVar24) {
      (pIVar61->IO).NavInputs[0x10] = 1.0;
      pIVar61->NavInputSource = ImGuiInputSource_Keyboard;
    }
    bVar24 = IsKeyDown(0x202);
    if (bVar24) {
      (pIVar61->IO).NavInputs[0x11] = 1.0;
      pIVar61->NavInputSource = ImGuiInputSource_Keyboard;
    }
    bVar24 = IsKeyDown(0x203);
    if (bVar24) {
      (pIVar61->IO).NavInputs[0x12] = 1.0;
      pIVar61->NavInputSource = ImGuiInputSource_Keyboard;
    }
    bVar24 = IsKeyDown(0x204);
    if (bVar24) {
      (pIVar61->IO).NavInputs[0x13] = 1.0;
      pIVar61->NavInputSource = ImGuiInputSource_Keyboard;
    }
    if ((pIVar61->IO).KeyCtrl == true) {
      (pIVar61->IO).NavInputs[0xe] = 1.0;
    }
    if ((pIVar61->IO).KeyShift == true) {
      (pIVar61->IO).NavInputs[0xf] = 1.0;
    }
  }
  pfVar43 = (pIVar61->IO).NavInputsDownDuration;
  pfVar55 = pfVar43;
  pfVar57 = (pIVar61->IO).NavInputsDownDurationPrev;
  for (lVar49 = 0x14; lVar49 != 0; lVar49 = lVar49 + -1) {
    *pfVar57 = *pfVar55;
    pfVar55 = pfVar55 + (ulong)bVar66 * -2 + 1;
    pfVar57 = pfVar57 + (ulong)bVar66 * -2 + 1;
  }
  for (lVar49 = 0; lVar49 != 0x14; lVar49 = lVar49 + 1) {
    fVar70 = -1.0;
    if (0.0 < (pIVar61->IO).NavInputs[lVar49]) {
      fVar70 = 0.0;
      if (0.0 <= pfVar43[lVar49]) {
        fVar70 = pfVar43[lVar49] + (pIVar61->IO).DeltaTime;
      }
    }
    pfVar43[lVar49] = fVar70;
  }
  if (pIVar61->NavInitResultId != 0) {
    NavInitRequestApplyResult();
  }
  pIVar61->NavInitRequest = false;
  pIVar61->NavInitRequestFromMove = false;
  pIVar61->NavInitResultId = 0;
  pIVar61->NavJustMovedToId = 0;
  if (pIVar61->NavMoveSubmitted == true) {
    NavMoveRequestApplyResult();
  }
  pIVar61->NavTabbingCounter = 0;
  pIVar61->NavMoveSubmitted = false;
  pIVar61->NavMoveScoringItems = false;
  if ((((pIVar61->NavMousePosDirty == true) && (pIVar61->NavIdIsAlive == true)) &&
      (pIVar61->NavDisableHighlight == false)) && (pIVar61->NavDisableMouseHover == true)) {
    bVar24 = pIVar61->NavWindow != (ImGuiWindow *)0x0;
  }
  else {
    bVar24 = false;
  }
  pIVar61->NavMousePosDirty = false;
  IVar32 = pIVar61->NavLayer;
  if (ImGuiNavLayer_Menu < IVar32) {
    __assert_fail("g.NavLayer == ImGuiNavLayer_Main || g.NavLayer == ImGuiNavLayer_Menu",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                  ,0x2a47,"void ImGui::NavUpdate()");
  }
  pIVar40 = pIVar61->NavWindow;
  pIVar51 = pIVar40;
  if (pIVar40 != (ImGuiWindow *)0x0) {
    for (; pIVar51 != (ImGuiWindow *)0x0; pIVar51 = pIVar51->ParentWindow) {
      if ((pIVar51->RootWindow == pIVar51) || ((pIVar51->Flags & 0x14000000) != 0)) {
        if (pIVar51 != pIVar40) {
          pIVar51->NavLastChildNavWindow = pIVar40;
        }
        break;
      }
    }
    if ((IVar32 == ImGuiNavLayer_Main) && (pIVar40->NavLastChildNavWindow != (ImGuiWindow *)0x0)) {
      pIVar40->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar64 = GImGui;
  pIVar40 = GetTopMostPopupModal();
  if (pIVar40 != (ImGuiWindow *)0x0) {
    pIVar64->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((pIVar64->NavWindowingTargetAnim != (ImGuiWindow *)0x0) &&
     (pIVar64->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar70 = (pIVar64->IO).DeltaTime * -10.0 + pIVar64->NavWindowingHighlightAlpha;
    fVar70 = (float)(-(uint)(0.0 <= fVar70) & (uint)fVar70);
    pIVar64->NavWindowingHighlightAlpha = fVar70;
    if ((pIVar64->DimBgRatio <= 0.0) && (fVar70 <= 0.0)) {
      pIVar64->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
    }
  }
  if ((pIVar40 == (ImGuiWindow *)0x0) && (pIVar64->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    bVar25 = IsNavInputTest(3,ImGuiInputReadMode_Pressed);
    if ((pIVar64->NavWindowingTarget != (ImGuiWindow *)0x0) || ((pIVar64->IO).KeyCtrl != true))
    goto LAB_001461db;
    bVar26 = IsKeyPressed(0x200,true);
  }
  else {
    bVar25 = false;
LAB_001461db:
    bVar26 = false;
  }
  if (((bVar25 | bVar26) == 1) &&
     ((pIVar40 = pIVar64->NavWindow, pIVar40 != (ImGuiWindow *)0x0 ||
      (pIVar40 = FindWindowNavFocusable((pIVar64->WindowsFocusOrder).Size + -1,-0x7fffffff,-1),
      pIVar40 != (ImGuiWindow *)0x0)))) {
    pIVar40 = pIVar40->RootWindow;
    pIVar64->NavWindowingTargetAnim = pIVar40;
    pIVar64->NavWindowingTarget = pIVar40;
    pIVar64->NavWindowingTimer = 0.0;
    pIVar64->NavWindowingHighlightAlpha = 0.0;
    pIVar64->NavWindowingToggleLayer = bVar25;
    pIVar64->NavInputSource = bVar26 ^ ImGuiInputSource_Gamepad;
  }
  fVar70 = (pIVar64->IO).DeltaTime + pIVar64->NavWindowingTimer;
  pIVar64->NavWindowingTimer = fVar70;
  if (pIVar64->NavWindowingTarget == (ImGuiWindow *)0x0) {
LAB_001463cd:
    bVar25 = false;
    pIVar40 = (ImGuiWindow *)0x0;
  }
  else {
    IVar31 = pIVar64->NavInputSource;
    if (IVar31 != ImGuiInputSource_Gamepad) {
LAB_00146338:
      if (IVar31 == ImGuiInputSource_Keyboard) {
        fVar82 = (pIVar64->NavWindowingTimer + -0.2) / 0.05;
        fVar70 = 1.0;
        if (fVar82 <= 1.0) {
          fVar70 = fVar82;
        }
        fVar70 = (float)(~-(uint)(fVar82 < 0.0) & (uint)fVar70);
        uVar68 = -(uint)(fVar70 <= pIVar64->NavWindowingHighlightAlpha);
        pIVar64->NavWindowingHighlightAlpha =
             (float)(uVar68 & (uint)pIVar64->NavWindowingHighlightAlpha | ~uVar68 & (uint)fVar70);
        bVar25 = IsKeyPressed(0x200,true);
        if (bVar25) {
          NavUpdateWindowingHighlightWindow((pIVar64->IO).KeyShift - 1 | 1);
        }
        if ((pIVar64->IO).KeyCtrl == false) {
          pIVar40 = pIVar64->NavWindowingTarget;
          bVar25 = false;
          goto LAB_001463d2;
        }
      }
      goto LAB_001463cd;
    }
    fVar82 = (fVar70 + -0.2) / 0.05;
    fVar70 = 1.0;
    if (fVar82 <= 1.0) {
      fVar70 = fVar82;
    }
    fVar70 = (float)(~-(uint)(fVar82 < 0.0) & (uint)fVar70);
    uVar68 = -(uint)(fVar70 <= pIVar64->NavWindowingHighlightAlpha);
    pIVar64->NavWindowingHighlightAlpha =
         (float)(uVar68 & (uint)pIVar64->NavWindowingHighlightAlpha | ~uVar68 & (uint)fVar70);
    bVar25 = IsNavInputTest(0xc,ImGuiInputReadMode_RepeatSlow);
    bVar26 = IsNavInputTest(0xd,ImGuiInputReadMode_RepeatSlow);
    if ((uint)bVar25 - (uint)bVar26 != 0) {
      NavUpdateWindowingHighlightWindow((uint)bVar25 - (uint)bVar26);
      pIVar64->NavWindowingHighlightAlpha = 1.0;
    }
    if (0.0 < (GImGui->IO).NavInputs[3]) {
      if (pIVar64->NavWindowingTarget == (ImGuiWindow *)0x0) goto LAB_001463cd;
      IVar31 = pIVar64->NavInputSource;
      goto LAB_00146338;
    }
    pbVar58 = &pIVar64->NavWindowingToggleLayer;
    *pbVar58 = (bool)(*pbVar58 &
                     (pIVar64->NavWindowingHighlightAlpha <= 1.0 &&
                     pIVar64->NavWindowingHighlightAlpha != 1.0));
    if (*pbVar58 == false) {
      pIVar40 = pIVar64->NavWindowingTarget;
      bVar25 = false;
    }
    else {
      bVar25 = pIVar64->NavWindow != (ImGuiWindow *)0x0;
      pIVar40 = (ImGuiWindow *)0x0;
    }
    pIVar64->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
LAB_001463d2:
  if ((((pIVar64->IO).ConfigFlags & 1) != 0) && (bVar26 = IsKeyPressed(0x283,true), bVar26)) {
    pIVar64->NavWindowingToggleLayer = true;
    pIVar64->NavInputSource = ImGuiInputSource_Keyboard;
  }
  if ((pIVar64->NavWindowingToggleLayer == true) &&
     (pIVar64->NavInputSource == ImGuiInputSource_Keyboard)) {
    if ((0 < (pIVar64->IO).InputQueueCharacters.Size) ||
       ((((pIVar64->IO).KeyCtrl != false || ((pIVar64->IO).KeyShift != false)) ||
        ((pIVar64->IO).KeySuper == true)))) {
      pIVar64->NavWindowingToggleLayer = false;
    }
    bVar26 = IsKeyReleased(0x283);
    if (((bVar26) && (pIVar64->NavWindowingToggleLayer == true)) &&
       ((pIVar64->ActiveId == 0 || (pIVar64->ActiveIdAllowOverlap == true)))) {
      bVar26 = IsMousePosValid(&(pIVar64->IO).MousePos);
      bVar27 = IsMousePosValid(&(pIVar64->IO).MousePosPrev);
      bVar25 = (bool)(bVar25 | bVar27 == bVar26);
    }
    bVar26 = IsKeyDown(0x283);
    if (!bVar26) {
      pIVar64->NavWindowingToggleLayer = false;
    }
  }
  if ((pIVar64->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     ((pIVar64->NavWindowingTarget->Flags & 4) == 0)) {
    IVar31 = pIVar64->NavInputSource;
    IVar74.x = 0.0;
    IVar74.y = 0.0;
    IVar73.x = 0.0;
    IVar73.y = 0.0;
    if (IVar31 == ImGuiInputSource_Keyboard) {
      if ((pIVar64->IO).KeyShift == false) {
        IVar74 = GetNavInputAmount2d(1,ImGuiInputReadMode_Down,0.0,0.0);
        IVar31 = pIVar64->NavInputSource;
        goto LAB_0014650a;
      }
    }
    else {
LAB_0014650a:
      IVar73 = IVar74;
      if (IVar31 == ImGuiInputSource_Gamepad) {
        IVar73 = GetNavInputAmount2d(8,ImGuiInputReadMode_Down,0.0,0.0);
      }
    }
    IVar93 = child_rect;
    fVar70 = IVar73.y;
    if (((IVar73.x != 0.0) || (fVar70 != 0.0)) || (NAN(fVar70))) {
      fVar82 = (pIVar64->IO).DisplayFramebufferScale.x;
      fVar71 = (pIVar64->IO).DisplayFramebufferScale.y;
      if (fVar71 <= fVar82) {
        fVar82 = fVar71;
      }
      fVar82 = (float)(int)(fVar82 * (pIVar64->IO).DeltaTime * 800.0);
      pIVar51 = pIVar64->NavWindowingTarget->RootWindowDockTree;
      child_rect.Min.y = (pIVar51->Pos).y + fVar70 * fVar82;
      child_rect.Min.x = (pIVar51->Pos).x + IVar73.x * fVar82;
      child_rect.Max = IVar93.Max;
      SetWindowPos(pIVar51,&child_rect.Min,1);
      MarkIniSettingsDirty(pIVar51);
      pIVar64->NavDisableMouseHover = true;
    }
  }
  if (pIVar40 != (ImGuiWindow *)0x0) {
    pIVar51 = pIVar64->NavWindow;
    if (pIVar51 == (ImGuiWindow *)0x0) {
      pIVar39 = (ImGuiViewportP *)0x0;
LAB_00146690:
      ClearActiveID();
      pIVar20 = GImGui;
      pIVar20->NavMousePosDirty = true;
      pIVar20->NavDisableHighlight = false;
      pIVar20->NavDisableMouseHover = true;
      pIVar40 = NavRestoreLastChildNavWindow(pIVar40);
      ClosePopupsOverWindow(pIVar40,false);
      FocusWindow(pIVar40);
      if (pIVar40->NavLastIds[0] == 0) {
        NavInitWindow(pIVar40,false);
      }
      if ((pIVar40->DC).NavLayersActiveMaskNext == 2) {
        pIVar64->NavLayer = ImGuiNavLayer_Menu;
      }
      if ((pIVar40->Viewport != pIVar39) &&
         (p_Var13 = (pIVar64->PlatformIO).Platform_SetWindowFocus,
         p_Var13 != (_func_void_ImGuiViewport_ptr *)0x0)) {
        (*p_Var13)(&pIVar40->Viewport->super_ImGuiViewport);
      }
    }
    else if (pIVar40 != pIVar51->RootWindow) {
      pIVar39 = pIVar51->Viewport;
      goto LAB_00146690;
    }
    pIVar64->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((bVar25) && (pIVar64->NavWindow != (ImGuiWindow *)0x0)) {
    IVar32 = ImGuiNavLayer_Menu;
    ClearActiveID();
    pIVar40 = pIVar64->NavWindow;
    pIVar51 = pIVar40;
    do {
      window = pIVar51;
      if ((window->ParentWindow == (ImGuiWindow *)0x0) ||
         (((window->DC).NavLayersActiveMask & 2) != 0)) break;
      pIVar51 = window->ParentWindow;
    } while ((window->Flags & 0x15000000U) == 0x1000000);
    if (window != pIVar40) {
      FocusWindow(window);
      window->NavLastChildNavWindow = pIVar40;
      pIVar40 = pIVar64->NavWindow;
    }
    IVar8 = pIVar64->NavLayer;
    if (((pIVar40->DC).NavLayersActiveMask & 2) == 0) {
      IVar32 = ImGuiNavLayer_Main;
      if (IVar8 == ImGuiNavLayer_Main) goto LAB_00146a1e;
    }
    else if (IVar8 == ImGuiNavLayer_Main) {
      if (window->DockNodeAsHost == (ImGuiDockNode *)0x0) {
        pIVar40->NavLastIds[1] = 0;
      }
    }
    else {
      IVar32 = IVar8 ^ ImGuiNavLayer_Menu;
    }
    NavRestoreLayer(IVar32);
    pIVar64 = GImGui;
    pIVar64->NavMousePosDirty = true;
    pIVar64->NavDisableHighlight = false;
    pIVar64->NavDisableMouseHover = true;
  }
LAB_00146a1e:
  if (((uVar46 & 1) == 0 && !bVar22) || (pIVar61->NavWindow == (ImGuiWindow *)0x0)) {
    (pIVar61->IO).NavActive = false;
LAB_00146a68:
    bVar25 = pIVar61->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  else {
    bVar25 = (pIVar61->NavWindow->Flags & 0x40000U) == 0;
    (pIVar61->IO).NavActive = bVar25;
    if (((!bVar25) || (pIVar61->NavId == 0)) ||
       (bVar25 = true, pIVar61->NavDisableHighlight != false)) goto LAB_00146a68;
  }
  (pIVar61->IO).NavVisible = bVar25;
  pIVar64 = GImGui;
  bVar25 = IsNavInputTest(1,ImGuiInputReadMode_Pressed);
  if (bVar25) {
    if (pIVar64->ActiveId == 0) {
      if (pIVar64->NavLayer == ImGuiNavLayer_Main) {
        pIVar40 = pIVar64->NavWindow;
        if (pIVar40 == (ImGuiWindow *)0x0) {
          if ((pIVar64->OpenPopupStack).Size < 1) goto LAB_001470b2;
LAB_00147083:
          pIVar41 = ImVector<ImGuiPopupData>::back(&pIVar64->OpenPopupStack);
          if ((pIVar41->Window->Flags & 0x8000000) == 0) {
            ClosePopupToLevel((pIVar64->OpenPopupStack).Size + -1,true);
          }
        }
        else if (((pIVar40 == pIVar40->RootWindow) || ((pIVar40->Flags & 0x4000000) != 0)) ||
                (pIVar51 = pIVar40->ParentWindow, pIVar51 == (ImGuiWindow *)0x0)) {
          if (0 < (pIVar64->OpenPopupStack).Size) goto LAB_00147083;
          if ((pIVar40->Flags & 0x5000000U) != 0x1000000) {
            pIVar40->NavLastIds[0] = 0;
          }
LAB_001470b2:
          pIVar64->NavId = 0;
          pIVar64->NavFocusScopeId = 0;
        }
        else {
          if (pIVar40->ChildId == 0) {
            __assert_fail("child_window->ChildId != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                          ,0x2bc6,"void ImGui::NavUpdateCancelRequest()");
          }
          child_rect = ImGuiWindow::Rect(pIVar40);
          FocusWindow(pIVar51);
          IVar47 = pIVar40->ChildId;
          local_58 = WindowRectAbsToRel(pIVar51,&child_rect);
          SetNavID(IVar47,ImGuiNavLayer_Main,0,&local_58);
          pIVar64 = GImGui;
          pIVar64->NavMousePosDirty = true;
          pIVar64->NavDisableHighlight = false;
          pIVar64->NavDisableMouseHover = true;
        }
      }
      else {
        NavRestoreLayer(ImGuiNavLayer_Main);
        pIVar64 = GImGui;
        pIVar64->NavMousePosDirty = true;
        pIVar64->NavDisableHighlight = false;
        pIVar64->NavDisableMouseHover = true;
      }
    }
    else if ((GImGui->ActiveIdUsingNavInputMask & 2) == 0) {
      ClearActiveID();
    }
  }
  pIVar61->NavActivateFlags = 0;
  pIVar61->NavActivateId = 0;
  pIVar61->NavActivateDownId = 0;
  pIVar61->NavActivatePressedId = 0;
  pIVar61->NavActivateInputId = 0;
  if (((pIVar61->NavId == 0) || (pIVar61->NavDisableHighlight != false)) ||
     (pIVar61->NavWindowingTarget != (ImGuiWindow *)0x0)) {
LAB_00146b18:
    if ((pIVar61->NavWindow != (ImGuiWindow *)0x0) && ((pIVar61->NavWindow->Flags & 0x40000) != 0))
    {
      pIVar61->NavDisableHighlight = true;
    }
  }
  else if (pIVar61->NavWindow != (ImGuiWindow *)0x0) {
    if ((pIVar61->NavWindow->Flags & 0x40000) != 0) goto LAB_00146b18;
    fVar70 = (GImGui->IO).NavInputs[0];
    fVar82 = (GImGui->IO).NavInputs[2];
    if (0.0 < fVar70) {
      bVar25 = IsNavInputTest(0,ImGuiInputReadMode_Pressed);
    }
    else {
      bVar25 = false;
    }
    if (fVar82 <= 0.0) {
      bVar26 = false;
    }
    else {
      bVar26 = IsNavInputTest(2,ImGuiInputReadMode_Pressed);
    }
    IVar47 = pIVar61->ActiveId;
    if (bVar25 == true && IVar47 == 0) {
      pIVar61->NavActivateId = pIVar61->NavId;
      pIVar61->NavActivateFlags = 2;
LAB_0014717b:
      if (bVar26 != false) {
        pIVar61->NavActivateInputId = pIVar61->NavId;
        pIVar61->NavActivateFlags = 1;
      }
      if (0.0 < fVar70) {
        pIVar61->NavActivateDownId = pIVar61->NavId;
      }
      if (bVar25 == false) goto LAB_00146b18;
      IVar47 = pIVar61->NavId;
    }
    else {
      if (IVar47 == 0) goto LAB_0014717b;
      IVar29 = pIVar61->NavId;
      if ((bVar26 & IVar47 == IVar29) != 0) {
        pIVar61->NavActivateInputId = IVar47;
        pIVar61->NavActivateFlags = 1;
      }
      if (IVar47 == IVar29 && 0.0 < fVar70) {
        pIVar61->NavActivateDownId = IVar47;
      }
      if ((bVar25 & IVar47 == IVar29) == 0) goto LAB_00146b18;
    }
    pIVar61->NavActivatePressedId = IVar47;
    goto LAB_00146b18;
  }
  if ((pIVar61->NavActivateId != 0) && (pIVar61->NavActivateDownId != pIVar61->NavActivateId)) {
    __assert_fail("g.NavActivateDownId == g.NavActivateId",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                  ,0x2a74,"void ImGui::NavUpdate()");
  }
  IVar47 = pIVar61->NavNextActivateId;
  if (IVar47 != 0) {
    if ((pIVar61->NavNextActivateFlags & 1U) == 0) {
      pIVar61->NavActivatePressedId = IVar47;
      pIVar61->NavActivateDownId = IVar47;
      pIVar61->NavActivateId = IVar47;
    }
    else {
      pIVar61->NavActivateInputId = IVar47;
    }
    pIVar61->NavActivateFlags = pIVar61->NavNextActivateFlags;
  }
  pIVar61->NavNextActivateId = 0;
  pIVar64 = GImGui;
  pIVar40 = GImGui->NavWindow;
  if ((pIVar40 != (ImGuiWindow *)0x0 & GImGui->NavMoveForwardToNextFrame) != 1) {
    GImGui->NavMoveDir = -1;
    pIVar64->NavMoveFlags = 0;
    pIVar64->NavMoveScrollFlags = 0;
    if (((pIVar40 != (ImGuiWindow *)0x0) && (pIVar64->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((pIVar40->Flags & 0x40000) == 0)) {
      if (((pIVar64->ActiveIdUsingNavDirMask & 1) == 0) &&
         ((bVar25 = IsNavInputTest(4,ImGuiInputReadMode_Repeat), bVar25 ||
          (bVar25 = IsNavInputTest(0x10,ImGuiInputReadMode_Repeat), bVar25)))) {
        pIVar64->NavMoveDir = 0;
      }
      if (((GImGui->ActiveIdUsingNavDirMask & 2) == 0) &&
         ((bVar25 = IsNavInputTest(5,ImGuiInputReadMode_Repeat), bVar25 ||
          (bVar25 = IsNavInputTest(0x11,ImGuiInputReadMode_Repeat), bVar25)))) {
        pIVar64->NavMoveDir = 1;
      }
      if (((GImGui->ActiveIdUsingNavDirMask & 4) == 0) &&
         ((bVar25 = IsNavInputTest(6,ImGuiInputReadMode_Repeat), bVar25 ||
          (bVar25 = IsNavInputTest(0x12,ImGuiInputReadMode_Repeat), bVar25)))) {
        pIVar64->NavMoveDir = 2;
      }
      if (((GImGui->ActiveIdUsingNavDirMask & 8) == 0) &&
         ((bVar25 = IsNavInputTest(7,ImGuiInputReadMode_Repeat), bVar25 ||
          (bVar25 = IsNavInputTest(0x13,ImGuiInputReadMode_Repeat), bVar25)))) {
        pIVar64->NavMoveDir = 3;
      }
    }
    iVar53 = pIVar64->NavMoveDir;
    pIVar64->NavMoveClipDir = iVar53;
    (pIVar64->NavScoringNoClipRect).Min.x = 3.4028235e+38;
    (pIVar64->NavScoringNoClipRect).Min.y = 3.4028235e+38;
    (pIVar64->NavScoringNoClipRect).Max.x = -3.4028235e+38;
    (pIVar64->NavScoringNoClipRect).Max.y = -3.4028235e+38;
    if (pIVar40 != (ImGuiWindow *)0x0) goto LAB_00146d2a;
    goto LAB_00147348;
  }
  iVar53 = GImGui->NavMoveDir;
  if ((iVar53 == -1) || (GImGui->NavMoveClipDir == -1)) {
    __assert_fail("g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                  ,0x2ad7,"void ImGui::NavUpdateCreateMoveRequest()");
  }
  if ((GImGui->NavMoveFlags & 0x80) == 0) {
    __assert_fail("g.NavMoveFlags & ImGuiNavMoveFlags_Forwarded",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                  ,0x2ad8,"void ImGui::NavUpdateCreateMoveRequest()");
  }
LAB_00146d2a:
  pIVar20 = GImGui;
  fVar70 = 0.0;
  if ((iVar53 == -1) && (((pIVar64->IO).ConfigFlags & 1U) != 0)) {
    pIVar51 = GImGui->NavWindow;
    if (((pIVar51->Flags & 0x40000) == 0) && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)) {
      bVar26 = IsKeyDown(0x205);
      bVar25 = false;
      bVar27 = false;
      if (bVar26) {
        bVar27 = IsActiveIdUsingKey(0x205);
        bVar27 = !bVar27;
      }
      bVar26 = IsKeyDown(0x206);
      if (bVar26) {
        bVar25 = IsActiveIdUsingKey(0x206);
        bVar25 = !bVar25;
      }
      bVar26 = IsKeyPressed(0x207,true);
      if (bVar26) {
        bVar26 = IsActiveIdUsingKey(0x207);
        bVar26 = !bVar26;
      }
      else {
        bVar26 = false;
      }
      bVar28 = IsKeyPressed(0x208,true);
      if (bVar28) {
        bVar28 = IsActiveIdUsingKey(0x208);
        bVar28 = !bVar28;
      }
      else {
        bVar28 = false;
      }
      if (!(bool)(bVar27 == bVar25 & (bVar26 ^ bVar28 ^ 1U))) {
        if (pIVar20->NavLayer != ImGuiNavLayer_Main) {
          NavRestoreLayer(ImGuiNavLayer_Main);
        }
        if (((pIVar51->DC).NavLayersActiveMask == 0) && ((pIVar51->DC).NavHasScroll == true)) {
          bVar25 = IsKeyPressed(0x205,true);
          if (bVar25) {
            (pIVar51->ScrollTarget).y =
                 (pIVar51->Scroll).y - ((pIVar51->InnerRect).Max.y - (pIVar51->InnerRect).Min.y);
            (pIVar51->ScrollTargetCenterRatio).y = 0.0;
            (pIVar51->ScrollTargetEdgeSnapDist).y = 0.0;
          }
          else {
            bVar25 = IsKeyPressed(0x206,true);
            if (!bVar25) {
              if (bVar26) {
                (pIVar51->ScrollTarget).y = 0.0;
              }
              else {
                if (!bVar28) goto LAB_00146fb0;
                (pIVar51->ScrollTarget).y = (pIVar51->ScrollMax).y;
              }
              (pIVar51->ScrollTargetCenterRatio).y = 0.0;
              (pIVar51->ScrollTargetEdgeSnapDist).y = 0.0;
              goto LAB_00146fb0;
            }
            (pIVar51->ScrollTarget).y =
                 ((pIVar51->InnerRect).Max.y - (pIVar51->InnerRect).Min.y) + (pIVar51->Scroll).y;
            (pIVar51->ScrollTargetCenterRatio).y = 0.0;
            (pIVar51->ScrollTargetEdgeSnapDist).y = 0.0;
          }
LAB_00147348:
          fVar70 = 0.0;
        }
        else {
          IVar32 = pIVar20->NavLayer;
          fVar70 = (pIVar51->InnerRect).Max.y;
          fVar82 = (pIVar51->InnerRect).Min.y;
          fVar71 = ImGuiWindow::CalcFontSize(pIVar51);
          fVar70 = (pIVar51->NavRectRel[IVar32].Max.y - pIVar51->NavRectRel[IVar32].Min.y) +
                   ((fVar70 - fVar82) - fVar71);
          fVar70 = (float)(~-(uint)(fVar70 <= 0.0) & (uint)fVar70);
          bVar25 = IsKeyPressed(0x205,true);
          if (bVar25) {
            fVar70 = -fVar70;
            IVar48 = 2;
            IVar33 = 3;
          }
          else {
            bVar25 = IsKeyPressed(0x206,true);
            if (!bVar25) {
              pIVar42 = pIVar51->NavRectRel + IVar32;
              if (bVar26) {
                pIVar51->NavRectRel[IVar32].Max.y = 0.0;
                pIVar51->NavRectRel[IVar32].Min.y = 0.0;
                fVar70 = (pIVar42->Min).x;
                pIVar37 = &pIVar51->NavRectRel[IVar32].Max;
                if (pIVar37->x <= fVar70 && fVar70 != pIVar37->x) {
                  pIVar51->NavRectRel[IVar32].Max.x = 0.0;
                  (pIVar42->Min).x = 0.0;
                }
                pIVar20->NavMoveDir = 3;
                pIVar20->NavMoveFlags = 0x50;
              }
              else if (bVar28) {
                fVar70 = (pIVar51->ContentSize).y;
                pIVar51->NavRectRel[IVar32].Max.y = fVar70;
                pIVar51->NavRectRel[IVar32].Min.y = fVar70;
                fVar70 = (pIVar42->Min).x;
                pIVar37 = &pIVar51->NavRectRel[IVar32].Max;
                if (pIVar37->x <= fVar70 && fVar70 != pIVar37->x) {
                  pIVar51->NavRectRel[IVar32].Max.x = 0.0;
                  (pIVar42->Min).x = 0.0;
                }
                pIVar20->NavMoveDir = 2;
                pIVar20->NavMoveFlags = 0x50;
              }
              goto LAB_00146fb0;
            }
            IVar33 = 2;
            IVar48 = 3;
          }
          pIVar20->NavMoveDir = IVar33;
          pIVar20->NavMoveClipDir = IVar48;
          pIVar20->NavMoveFlags = 0x30;
          if ((fVar70 != 0.0) || (NAN(fVar70))) {
            IVar74 = (pIVar40->InnerRect).Max;
            (pIVar64->NavScoringNoClipRect).Min = (pIVar40->InnerRect).Min;
            (pIVar64->NavScoringNoClipRect).Max = IVar74;
            (pIVar64->NavScoringNoClipRect).Min.y = (pIVar64->NavScoringNoClipRect).Min.y + fVar70;
            (pIVar64->NavScoringNoClipRect).Max.y = (pIVar64->NavScoringNoClipRect).Max.y + fVar70;
          }
        }
        goto LAB_0014734b;
      }
    }
LAB_00146fb0:
    fVar70 = 0.0;
  }
LAB_0014734b:
  pIVar64->NavMoveForwardToNextFrame = false;
  if (pIVar64->NavMoveDir != -1) {
    NavMoveRequestSubmit
              (pIVar64->NavMoveDir,pIVar64->NavMoveClipDir,pIVar64->NavMoveFlags,
               pIVar64->NavMoveScrollFlags);
  }
  if (pIVar64->NavMoveSubmitted == true) {
    if (pIVar64->NavId == 0) {
      pIVar64->NavInitRequest = true;
      pIVar64->NavInitRequestFromMove = true;
      pIVar64->NavInitResultId = 0;
      pIVar64->NavDisableHighlight = false;
    }
    if ((pIVar64->NavInputSource != ImGuiInputSource_Gamepad) ||
       (pIVar64->NavLayer != ImGuiNavLayer_Main || pIVar40 == (ImGuiWindow *)0x0))
    goto LAB_00147533;
    iVar53 = -(uint)((pIVar64->NavMoveFlags & 5U) == 0);
    iVar67 = -(uint)((pIVar64->NavMoveFlags & 10U) == 0);
    local_58.Min.y = (pIVar40->InnerRect).Min.y + -1.0;
    local_58.Min.x = (pIVar40->InnerRect).Min.x + -1.0;
    local_58.Max.x = (pIVar40->InnerRect).Max.x + 1.0;
    local_58.Max.y = (pIVar40->InnerRect).Max.y + 1.0;
    child_rect = WindowRectAbsToRel(pIVar40,&local_58);
    auVar16._4_4_ = iVar67;
    auVar16._0_4_ = iVar53;
    auVar16._8_4_ = 0xffffffff;
    auVar16._12_4_ = 0xffffffff;
    auVar80._4_4_ = iVar67;
    auVar80._0_4_ = iVar67;
    auVar80._8_4_ = iVar67;
    auVar80._12_4_ = iVar67;
    if ((((auVar80 | auVar16) & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
       (bVar25 = ImRect::Contains(&child_rect,pIVar40->NavRectRel + pIVar64->NavLayer),
       IVar93 = child_rect, !bVar25)) {
      fVar82 = ImGuiWindow::CalcFontSize(pIVar40);
      local_68._0_4_ = IVar93.Min.x;
      fStack_60 = IVar93.Max.x;
      fStack_5c = IVar93.Max.y;
      local_68._4_4_ = child_rect.Max.y - child_rect.Min.y;
      local_68._0_4_ = fStack_60 - (float)local_68._0_4_;
      fStack_60 = fStack_5c - fStack_60;
      fStack_5c = 0.0 - fStack_5c;
      fVar71 = ImGuiWindow::CalcFontSize(pIVar40);
      auVar85._0_4_ = fVar82 * 0.5;
      auVar85._4_4_ = fVar71 * 0.5;
      auVar85._8_4_ = extraout_XMM0_Db * 0.0;
      auVar85._12_4_ = extraout_XMM0_Db_00 * 0.0;
      auVar89 = minps(_local_68,auVar85);
      fVar82 = child_rect.Min.x;
      fVar71 = child_rect.Min.y;
      auVar15._4_4_ = child_rect.Max.x;
      auVar15._8_4_ = child_rect.Max.y;
      auVar15._0_4_ = fVar71 - extraout_XMM0_Db_00;
      auVar86._0_8_ = auVar15._0_8_ << 0x20;
      auVar86._8_4_ = child_rect.Max.x - auVar89._0_4_;
      auVar86._12_4_ = child_rect.Max.y - auVar89._4_4_;
      child_rect.Max =
           (ImVec2)(~CONCAT44(iVar67,iVar53) & 0x7f7fffff7f7fffff |
                   auVar86._8_8_ & CONCAT44(iVar67,iVar53));
      child_rect.Min =
           (ImVec2)(~CONCAT44(iVar67,iVar53) & 0xff7fffffff7fffff |
                   CONCAT44(auVar89._4_4_ + fVar71,auVar89._0_4_ + fVar82) & CONCAT44(iVar67,iVar53)
                   );
      ImRect::ClipWithFull(pIVar40->NavRectRel + pIVar64->NavLayer,&child_rect);
      pIVar64->NavId = 0;
      pIVar64->NavFocusScopeId = 0;
    }
LAB_00147544:
    IVar32 = pIVar64->NavLayer;
    fVar82 = pIVar40->NavRectRel[IVar32].Min.x;
    pIVar37 = &pIVar40->NavRectRel[IVar32].Max;
    if ((pIVar37->x <= fVar82 && fVar82 != pIVar37->x) ||
       (fVar82 = pIVar40->NavRectRel[IVar32].Min.y, pfVar43 = &pIVar40->NavRectRel[IVar32].Max.y,
       *pfVar43 <= fVar82 && fVar82 != *pfVar43)) {
      local_58.Min.x = 0.0;
      local_58.Min.y = 0.0;
      local_58.Max.x = 0.0;
      local_58.Max.y = 0.0;
    }
    else {
      local_58.Min = pIVar40->NavRectRel[IVar32].Min;
      local_58.Max = pIVar40->NavRectRel[IVar32].Max;
    }
    IVar93 = WindowRectRelToAbs(pIVar40,&local_58);
    fVar71 = IVar93.Min.y + fVar70;
    auVar18._4_4_ = child_rect.Max.x;
    auVar18._8_4_ = child_rect.Max.y;
    auVar18._0_4_ = fVar71;
    child_rect._0_12_ = auVar18 << 0x20;
    fVar82 = IVar93.Min.x + 1.0;
    if (IVar93.Max.x <= fVar82) {
      fVar82 = IVar93.Max.x;
    }
    fVar70 = IVar93.Max.y + fVar70;
    child_rect.Max.y = fVar70;
    child_rect.Min.x = fVar82;
    child_rect.Max.x = fVar82;
    if (fVar70 < fVar71) {
      __assert_fail("!scoring_rect.IsInverted()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                    ,0x2b31,"void ImGui::NavUpdateCreateMoveRequest()");
    }
  }
  else {
LAB_00147533:
    child_rect = (ImRect)ZEXT816(0);
    if (pIVar40 != (ImGuiWindow *)0x0) goto LAB_00147544;
  }
  (pIVar64->NavScoringRect).Min = child_rect.Min;
  (pIVar64->NavScoringRect).Max = child_rect.Max;
  ImRect::Add(&pIVar64->NavScoringNoClipRect,&child_rect);
  pIVar64 = GImGui;
  if (pIVar61->NavMoveDir == -1) {
    if (GImGui->NavMoveDir != -1) {
      __assert_fail("g.NavMoveDir == ImGuiDir_None",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                    ,0x2b3d,"void ImGui::NavUpdateCreateTabbingRequest()");
    }
    pIVar40 = GImGui->NavWindow;
    if ((((((pIVar40 != (ImGuiWindow *)0x0) && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0))
          && ((pIVar40->Flags & 0x40000) == 0)) &&
         ((bVar25 = IsKeyPressed(0x200,true), bVar25 &&
          (bVar25 = IsActiveIdUsingKey(0x200), !bVar25)))) && ((pIVar64->IO).KeyCtrl == false)) &&
       ((pIVar64->IO).KeyAlt == false)) {
      if ((pIVar64->IO).KeyShift == false) {
        uVar68 = (uint)(pIVar64->ActiveId != 0);
      }
      else {
        uVar68 = 0xffffffff;
      }
      pIVar64->NavTabbingDir = uVar68;
      scroll_flags = 3;
      if (pIVar40->Appearing != false) {
        scroll_flags = 0x21;
      }
      NavMoveRequestSubmit(-1,uVar68 >> 0x1f ^ 3,0x400,scroll_flags);
      (pIVar64->NavTabbingResultFirst).InFlags = 0;
      (pIVar64->NavTabbingResultFirst).Window = (ImGuiWindow *)0x0;
      (pIVar64->NavTabbingResultFirst).ID = 0;
      (pIVar64->NavTabbingResultFirst).FocusScopeId = 0;
      (pIVar64->NavTabbingResultFirst).DistAxial = 3.4028235e+38;
      (pIVar64->NavTabbingResultFirst).DistBox = 3.4028235e+38;
      (pIVar64->NavTabbingResultFirst).DistCenter = 3.4028235e+38;
      pIVar64->NavTabbingCounter = -1;
    }
  }
  NavUpdateAnyRequestFlag();
  pIVar61->NavIdIsAlive = false;
  pIVar40 = pIVar61->NavWindow;
  if (((pIVar40 != (ImGuiWindow *)0x0) && ((pIVar40->Flags & 0x40000) == 0)) &&
     (pIVar61->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar70 = ImGuiWindow::CalcFontSize(pIVar40);
    fVar70 = (float)(int)(fVar70 * 100.0 * (pIVar61->IO).DeltaTime + 0.5);
    if (((pIVar40->DC).NavLayersActiveMask == 0) &&
       (uVar68 = pIVar61->NavMoveDir, (uVar68 != 0xffffffff & (pIVar40->DC).NavHasScroll) == 1)) {
      if (uVar68 < 2) {
        (pIVar40->ScrollTarget).x =
             (float)(int)(*(float *)(&DAT_001c3550 + (ulong)(uVar68 == 0) * 4) * fVar70 +
                         (pIVar40->Scroll).x);
        (pIVar40->ScrollTargetCenterRatio).x = 0.0;
        (pIVar40->ScrollTargetEdgeSnapDist).x = 0.0;
      }
      if ((uVar68 & 0xfffffffe) == 2) {
        (pIVar40->ScrollTarget).y =
             (float)(int)(*(float *)(&DAT_001c3550 + (ulong)(uVar68 == 2) * 4) * fVar70 +
                         (pIVar40->Scroll).y);
        (pIVar40->ScrollTargetCenterRatio).y = 0.0;
        (pIVar40->ScrollTargetEdgeSnapDist).y = 0.0;
      }
    }
    IVar74 = GetNavInputAmount2d(8,ImGuiInputReadMode_Down,0.1,10.0);
    fVar82 = IVar74.x;
    fVar71 = IVar74.y;
    if (((fVar82 != 0.0) || (NAN(fVar82))) && (pIVar40->ScrollbarX == true)) {
      (pIVar40->ScrollTarget).x = (float)(int)(fVar82 * fVar70 + (pIVar40->Scroll).x);
      (pIVar40->ScrollTargetCenterRatio).x = 0.0;
      (pIVar40->ScrollTargetEdgeSnapDist).x = 0.0;
    }
    if ((fVar71 != 0.0) || (NAN(fVar71))) {
      (pIVar40->ScrollTarget).y = (float)(int)(fVar71 * fVar70 + (pIVar40->Scroll).y);
      (pIVar40->ScrollTargetCenterRatio).y = 0.0;
      (pIVar40->ScrollTargetEdgeSnapDist).y = 0.0;
    }
  }
  if ((uVar46 & 1) == 0 && !bVar22) {
    pIVar61->NavDisableHighlight = true;
    pIVar61->NavDisableMouseHover = false;
  }
  else if (((bVar24) && (((pIVar61->IO).ConfigFlags & 4) != 0)) &&
          (((pIVar61->IO).BackendFlags & 4) != 0)) {
    IVar74 = NavCalcPreferredRefPos();
    (pIVar61->IO).MousePosPrev = IVar74;
    (pIVar61->IO).MousePos = IVar74;
    (pIVar61->IO).WantSetMousePos = true;
  }
  pIVar61->NavScoringDebugCount = 0;
  pIVar64 = GImGui;
  pIVar37 = &(GImGui->IO).MousePos;
  bVar22 = IsMousePosValid(pIVar37);
  if (bVar22) {
    fVar70 = ImFloorSigned((pIVar64->IO).MousePos.x);
    fVar82 = ImFloorSigned((pIVar64->IO).MousePos.y);
    (pIVar64->MouseLastValidPos).x = fVar70;
    (pIVar64->MouseLastValidPos).y = fVar82;
    (pIVar64->IO).MousePos.x = fVar70;
    (pIVar64->IO).MousePos.y = fVar82;
  }
  bVar22 = IsMousePosValid(pIVar37);
  if ((bVar22) && (bVar22 = IsMousePosValid(&(pIVar64->IO).MousePosPrev), bVar22)) {
    IVar74 = (pIVar64->IO).MousePos;
    IVar73 = (pIVar64->IO).MousePosPrev;
    IVar75.x = IVar74.x - IVar73.x;
    IVar75.y = IVar74.y - IVar73.y;
    (pIVar64->IO).MouseDelta = IVar75;
    if ((((IVar75.x != 0.0) || (NAN(IVar75.x))) || (IVar75.y != 0.0)) || (NAN(IVar75.y))) {
      pIVar64->NavDisableMouseHover = false;
    }
  }
  else {
    (pIVar64->IO).MouseDelta.x = 0.0;
    (pIVar64->IO).MouseDelta.y = 0.0;
  }
  (pIVar64->IO).MousePosPrev = (pIVar64->IO).MousePos;
  lVar49 = 0x36ca;
  lVar63 = 0x36de;
  lVar65 = 0;
  for (lVar59 = 0x36c0; pIVar61 = local_38, lVar59 != 0x36c5; lVar59 = lVar59 + 1) {
    if (*(char *)((long)pIVar64 + lVar63 + -0x293a) == '\x01') {
      fVar70 = *(float *)((long)pIVar64 + lVar59 * 4 + -42000);
      pbVar58 = &pIVar64->Initialized + lVar59;
      *(bool *)((long)pIVar64 + lVar63 + -0x1e) = fVar70 < 0.0;
      pbVar54 = &pIVar64->Initialized + lVar49;
      *(undefined2 *)((long)pIVar64 + lVar59 * 2 + -0x36b6) = 0;
      (&pIVar64->Initialized)[lVar63] = false;
      *(float *)((long)pIVar64 + lVar59 * 4 + -0xa3fc) = fVar70;
      if (0.0 <= fVar70) {
        *(float *)((long)pIVar64 + lVar59 * 4 + -42000) = fVar70 + (pIVar64->IO).DeltaTime;
        bVar22 = IsMousePosValid(pIVar37);
        auVar81 = ZEXT816(0);
        if (bVar22) {
          IVar74 = (pIVar64->IO).MousePos;
          uVar7 = *(undefined8 *)((long)pIVar64 + lVar59 * 8 + -0x17f94);
          auVar81._0_4_ = IVar74.x - (float)uVar7;
          auVar81._4_4_ = IVar74.y - (float)((ulong)uVar7 >> 0x20);
          auVar81._8_8_ = 0;
        }
        fVar70 = *(float *)((long)pIVar64 + lVar59 * 4 + -0xa3c0);
        fVar82 = auVar81._0_4_ * auVar81._0_4_ + auVar81._4_4_ * auVar81._4_4_;
        uVar46 = -(uint)(fVar82 <= fVar70);
        *(uint *)((long)pIVar64 + lVar59 * 4 + -0xa3c0) =
             ~uVar46 & (uint)fVar82 | (uint)fVar70 & uVar46;
        uVar7 = *(undefined8 *)((long)pIVar64 + lVar59 * 8 + -0x17ee8);
        auVar90._0_8_ = auVar81._0_8_ ^ 0x8000000080000000;
        auVar90._8_4_ = auVar81._8_4_ ^ 0x80000000;
        auVar90._12_4_ = auVar81._12_4_ ^ 0x80000000;
        auVar89 = maxps(auVar90,auVar81);
        fVar70 = (float)uVar7;
        fVar82 = (float)((ulong)uVar7 >> 0x20);
        uVar46 = -(uint)(auVar89._0_4_ <= fVar70);
        uVar68 = -(uint)(auVar89._4_4_ <= fVar82);
        puVar6 = (uint *)((long)pIVar64 + lVar59 * 8 + -0x17ee8);
        *puVar6 = ~uVar46 & (uint)auVar89._0_4_ | (uint)fVar70 & uVar46;
        puVar6[1] = ~uVar68 & (uint)auVar89._4_4_ | (uint)fVar82 & uVar68;
      }
      else {
        *(undefined4 *)((long)pIVar64 + lVar59 * 4 + -42000) = 0;
        if ((pIVar64->IO).MouseDoubleClickTime <=
            (float)(pIVar64->Time - *(double *)((long)pIVar64 + lVar59 * 8 + -0x17f68))) {
LAB_00147adc:
          *(undefined2 *)((long)pIVar64 + lVar59 * 2 + -0x36ac) = 1;
        }
        else {
          bVar22 = IsMousePosValid(pIVar37);
          fVar70 = 0.0;
          fVar82 = 0.0;
          if (bVar22) {
            IVar74 = (pIVar64->IO).MousePos;
            uVar7 = *(undefined8 *)((long)pIVar64 + lVar59 * 8 + -0x17f94);
            fVar70 = IVar74.x - (float)uVar7;
            fVar82 = IVar74.y - (float)((ulong)uVar7 >> 0x20);
          }
          fVar71 = (pIVar64->IO).MouseDoubleClickMaxDist;
          if (fVar71 * fVar71 <= fVar70 * fVar70 + fVar82 * fVar82) goto LAB_00147adc;
          psVar5 = (short *)((long)pIVar64 + lVar59 * 2 + -0x36ac);
          *psVar5 = *psVar5 + 1;
        }
        *(double *)((long)pIVar64 + lVar59 * 8 + -0x17f68) = pIVar64->Time;
        *(ImVec2 *)((long)pIVar64 + lVar59 * 8 + -0x17f94) = (pIVar64->IO).MousePos;
        *(undefined2 *)((long)pIVar64 + lVar59 * 2 + -0x36b6) =
             *(undefined2 *)((long)pIVar64 + lVar59 * 2 + -0x36ac);
        *(undefined8 *)((long)pIVar64 + lVar59 * 8 + -0x17ee8) = 0;
        *(undefined4 *)((long)pIVar64 + lVar59 * 4 + -0xa3c0) = 0;
      }
    }
    else {
      *(undefined1 *)((long)pIVar64 + lVar63 + -0x1e) = 0;
      *(undefined2 *)((long)pIVar64 + lVar59 * 2 + -0x36b6) = 0;
      fVar70 = *(float *)((long)pIVar64 + lVar59 * 4 + -42000);
      (&pIVar64->Initialized)[lVar63] = 0.0 <= fVar70;
      pbVar58 = (pIVar64->IO).MouseClicked + lVar65;
      pbVar54 = (bool *)((pIVar64->IO).MouseClickedCount + lVar65);
      *(float *)((long)pIVar64 + lVar59 * 4 + -0xa3fc) = fVar70;
      *(undefined4 *)((long)pIVar64 + lVar59 * 4 + -42000) = 0xbf800000;
    }
    *(bool *)((long)pIVar64 + lVar63 + -0x19) = *(short *)pbVar54 == 2;
    if (*pbVar58 == true) {
      pIVar64->NavDisableMouseHover = false;
    }
    lVar65 = lVar65 + 1;
    lVar49 = lVar49 + 2;
    lVar63 = lVar63 + 1;
  }
  DockContextNewFrameUpdateUndocking(local_38);
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar40 = GetTopMostPopupModal();
  if ((pIVar40 != (ImGuiWindow *)0x0) ||
     ((pIVar61->NavWindowingTarget != (ImGuiWindow *)0x0 &&
      (0.0 < pIVar61->NavWindowingHighlightAlpha)))) {
    fVar70 = (pIVar61->IO).DeltaTime * 6.0 + pIVar61->DimBgRatio;
    if (1.0 <= fVar70) {
      fVar70 = 1.0;
    }
    pIVar61->DimBgRatio = fVar70;
  }
  else {
    fVar70 = (pIVar61->IO).DeltaTime * -10.0 + pIVar61->DimBgRatio;
    pIVar61->DimBgRatio = (float)(-(uint)(0.0 <= fVar70) & (uint)fVar70);
  }
  pIVar61->MouseCursor = 0;
  pIVar61->WantTextInputNextFrame = -1;
  pIVar61->WantCaptureMouseNextFrame = -1;
  pIVar61->WantCaptureKeyboardNextFrame = -1;
  uVar21 = *(undefined3 *)&(pIVar61->PlatformImeData).field_0x1;
  fVar70 = (pIVar61->PlatformImeData).InputPos.x;
  uVar7 = *(undefined8 *)&(pIVar61->PlatformImeData).InputPos.y;
  (pIVar61->PlatformImeDataPrev).WantVisible = (pIVar61->PlatformImeData).WantVisible;
  *(undefined3 *)&(pIVar61->PlatformImeDataPrev).field_0x1 = uVar21;
  (pIVar61->PlatformImeDataPrev).InputPos.x = fVar70;
  *(undefined8 *)&(pIVar61->PlatformImeDataPrev).InputPos.y = uVar7;
  (pIVar61->PlatformImeData).WantVisible = false;
  pIVar64 = GImGui;
  if (GImGui->WheelingWindow != (ImGuiWindow *)0x0) {
    GImGui->WheelingWindowTimer = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
    bVar22 = IsMousePosValid((ImVec2 *)0x0);
    if (((bVar22) &&
        (fVar82 = (pIVar64->IO).MousePos.x - (pIVar64->WheelingWindowRefMousePos).x,
        fVar71 = (pIVar64->IO).MousePos.y - (pIVar64->WheelingWindowRefMousePos).y,
        fVar70 = (pIVar64->IO).MouseDragThreshold,
        fVar70 * fVar70 < fVar82 * fVar82 + fVar71 * fVar71)) ||
       (pIVar64->WheelingWindowTimer <= 0.0)) {
      pIVar64->WheelingWindow = (ImGuiWindow *)0x0;
      pIVar64->WheelingWindowTimer = 0.0;
    }
  }
  fVar70 = (pIVar64->IO).MouseWheel;
  if ((((((fVar70 != 0.0) || (fVar82 = (pIVar64->IO).MouseWheelH, fVar82 != 0.0)) || (NAN(fVar82)))
       && ((pIVar64->ActiveId == 0 || (pIVar64->ActiveIdUsingMouseWheel == false)))) &&
      ((pIVar64->HoveredIdPreviousFrame == 0 ||
       (pIVar64->HoveredIdPreviousFrameUsingMouseWheel == false)))) &&
     (((pIVar40 = pIVar64->WheelingWindow, pIVar40 != (ImGuiWindow *)0x0 ||
       (pIVar40 = pIVar64->HoveredWindow, pIVar40 != (ImGuiWindow *)0x0)) &&
      (pIVar40->Collapsed == false)))) {
    bVar22 = (pIVar64->IO).KeyCtrl;
    if ((fVar70 != 0.0) || (NAN(fVar70))) {
      if ((bVar22 & 1U) == 0) goto LAB_00148258;
      if ((pIVar64->IO).FontAllowUserScaling == true) {
        StartLockWheelingWindow(pIVar40);
        IVar93 = child_rect;
        fVar70 = pIVar40->FontWindowScale;
        fVar71 = (pIVar64->IO).MouseWheel * 0.1 + fVar70;
        fVar82 = 2.5;
        if (fVar71 <= 2.5) {
          fVar82 = fVar71;
        }
        fVar82 = (float)(-(uint)(fVar71 < 0.5) & 0x3f000000 | ~-(uint)(fVar71 < 0.5) & (uint)fVar82)
        ;
        pIVar40->FontWindowScale = fVar82;
        if (pIVar40 == pIVar40->RootWindow) {
          fVar82 = fVar82 / fVar70;
          IVar74 = pIVar40->Size;
          auVar87._8_8_ = 0;
          auVar87._0_4_ = IVar74.x;
          auVar87._4_4_ = IVar74.y;
          IVar73 = (pIVar64->IO).MousePos;
          fVar70 = (pIVar40->Pos).x;
          fVar71 = (pIVar40->Pos).y;
          auVar91._0_4_ = (IVar73.x - fVar70) * (1.0 - fVar82) * IVar74.x;
          auVar91._4_4_ = (IVar73.y - fVar71) * (1.0 - fVar82) * IVar74.y;
          auVar91._8_8_ = 0;
          auVar89 = divps(auVar91,auVar87);
          child_rect.Min.y = auVar89._4_4_ + fVar71;
          child_rect.Min.x = auVar89._0_4_ + fVar70;
          child_rect.Max = IVar93.Max;
          SetWindowPos(pIVar40,&child_rect.Min,0);
          IVar76.x = (float)(int)((pIVar40->Size).x * fVar82);
          IVar76.y = (float)(int)((pIVar40->Size).y * fVar82);
          IVar83.x = (float)(int)((pIVar40->SizeFull).x * fVar82);
          IVar83.y = (float)(int)((pIVar40->SizeFull).y * fVar82);
          pIVar40->Size = IVar76;
          pIVar40->SizeFull = IVar83;
        }
      }
    }
    else if ((bVar22 & 1U) == 0) {
LAB_00148258:
      if (((pIVar64->IO).KeyShift != true) ||
         (local_b8 = fVar70, (pIVar64->IO).ConfigMacOSXBehaviors == true)) {
        local_b8 = (pIVar64->IO).MouseWheelH;
        if ((fVar70 != 0.0) || (NAN(fVar70))) {
          StartLockWheelingWindow(pIVar40);
          while ((uVar46 = pIVar40->Flags, (uVar46 >> 0x18 & 1) != 0 &&
                 (((uVar46 & 0x210) == 0x10 ||
                  ((fVar82 = (pIVar40->ScrollMax).y, fVar82 == 0.0 && (!NAN(fVar82)))))))) {
            pIVar40 = pIVar40->ParentWindow;
          }
          if ((uVar46 & 0x210) == 0) {
            fVar71 = ((pIVar40->InnerRect).Max.y - (pIVar40->InnerRect).Min.y) * 0.67;
            fVar72 = ImGuiWindow::CalcFontSize(pIVar40);
            fVar82 = fVar72 * 5.0;
            if (fVar71 <= fVar72 * 5.0) {
              fVar82 = fVar71;
            }
            (pIVar40->ScrollTarget).y = (pIVar40->Scroll).y - fVar70 * (float)(int)fVar82;
            (pIVar40->ScrollTargetCenterRatio).y = 0.0;
            (pIVar40->ScrollTargetEdgeSnapDist).y = 0.0;
          }
        }
      }
      if ((local_b8 != 0.0) || (NAN(local_b8))) {
        StartLockWheelingWindow(pIVar40);
        while ((uVar46 = pIVar40->Flags, (uVar46 >> 0x18 & 1) != 0 &&
               (((uVar46 & 0x210) == 0x10 ||
                ((fVar70 = (pIVar40->ScrollMax).x, fVar70 == 0.0 && (!NAN(fVar70)))))))) {
          pIVar40 = pIVar40->ParentWindow;
        }
        if ((uVar46 & 0x210) == 0) {
          fVar82 = ((pIVar40->InnerRect).Max.x - (pIVar40->InnerRect).Min.x) * 0.67;
          fVar71 = ImGuiWindow::CalcFontSize(pIVar40);
          fVar70 = fVar71 + fVar71;
          if (fVar82 <= fVar71 + fVar71) {
            fVar70 = fVar82;
          }
          (pIVar40->ScrollTarget).x = (pIVar40->Scroll).x - local_b8 * (float)(int)fVar70;
          (pIVar40->ScrollTargetCenterRatio).x = 0.0;
          (pIVar40->ScrollTargetEdgeSnapDist).x = 0.0;
        }
      }
    }
  }
  iVar53 = (pIVar61->Windows).Size;
  if (iVar53 < (pIVar61->WindowsFocusOrder).Size) {
    __assert_fail("g.WindowsFocusOrder.Size <= g.Windows.Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                  ,0x11e4,"void ImGui::NewFrame()");
  }
  local_b8 = 3.4028235e+38;
  if ((pIVar61->GcCompactAll == false) &&
     (fVar70 = (pIVar61->IO).ConfigMemoryCompactTimer, 0.0 <= fVar70)) {
    local_b8 = (float)pIVar61->Time - fVar70;
  }
  for (iVar67 = 0; iVar67 != iVar53; iVar67 = iVar67 + 1) {
    ppIVar38 = ImVector<ImGuiWindow_*>::operator[](&pIVar61->Windows,iVar67);
    pIVar40 = *ppIVar38;
    bVar22 = pIVar40->Active;
    pIVar40->WasActive = bVar22;
    pIVar40->BeginCount = 0;
    pIVar40->Active = false;
    pIVar40->WriteAccessed = false;
    if (((bVar22 == false) && (pIVar40->MemoryCompacted == false)) &&
       (pIVar40->LastTimeActive <= local_b8 && local_b8 != pIVar40->LastTimeActive)) {
      GcCompactTransientWindowBuffers(pIVar40);
    }
    iVar53 = (pIVar61->Windows).Size;
  }
  this_01 = &pIVar61->TablesLastTimeActive;
  for (iVar53 = 0; iVar53 < this_01->Size; iVar53 = iVar53 + 1) {
    pfVar43 = ImVector<float>::operator[](this_01,iVar53);
    if ((0.0 <= *pfVar43) &&
       (pfVar43 = ImVector<float>::operator[](this_01,iVar53),
       *pfVar43 <= local_b8 && local_b8 != *pfVar43)) {
      table = ImVector<ImGuiTable>::operator[](&(pIVar61->Tables).Buf,iVar53);
      TableGcCompactTransientBuffers(table);
    }
  }
  this_02 = &pIVar61->TablesTempData;
  for (iVar53 = 0; iVar53 < this_02->Size; iVar53 = iVar53 + 1) {
    pIVar44 = ImVector<ImGuiTableTempData>::operator[](this_02,iVar53);
    if ((0.0 <= pIVar44->LastTimeActive) &&
       (pIVar44 = ImVector<ImGuiTableTempData>::operator[](this_02,iVar53),
       pIVar44->LastTimeActive <= local_b8 && local_b8 != pIVar44->LastTimeActive)) {
      pIVar44 = ImVector<ImGuiTableTempData>::operator[](this_02,iVar53);
      TableGcCompactTransientBuffers(pIVar44);
    }
  }
  if (pIVar61->GcCompactAll != false) {
    GcCompactTransientMiscBuffers();
  }
  pIVar61->GcCompactAll = false;
  if ((pIVar61->NavWindow != (ImGuiWindow *)0x0) && (pIVar61->NavWindow->WasActive == false)) {
    FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
  }
  ImVector<ImGuiWindowStackData>::resize(&pIVar61->CurrentWindowStack,0);
  ImVector<ImGuiPopupData>::resize(&pIVar61->BeginPopupStack,0);
  ImVector<int>::resize(&pIVar61->ItemFlagsStack,0);
  auVar19._12_4_ = 0;
  auVar19._0_4_ = child_rect.Min.y;
  auVar19._4_4_ = child_rect.Max.x;
  auVar19._8_4_ = child_rect.Max.y;
  child_rect = (ImRect)(auVar19 << 0x20);
  ImVector<int>::push_back(&pIVar61->ItemFlagsStack,(int *)&child_rect);
  ImVector<ImGuiGroupData>::resize(&pIVar61->GroupStack,0);
  DockContextNewFrameUpdateDocking(pIVar61);
  pIVar64 = GImGui;
  GImGui->DebugItemPickerBreakId = 0;
  if (pIVar64->DebugItemPickerActive == true) {
    uVar46 = pIVar64->HoveredIdPreviousFrame;
    pIVar64->MouseCursor = 7;
    bVar22 = IsKeyPressed(0x20e,true);
    if (bVar22) {
      pIVar64->DebugItemPickerActive = false;
    }
    pIVar20 = GImGui;
    if (uVar46 != 0 && (GImGui->IO).MouseDownDuration[0] == 0.0) {
      pIVar64->DebugItemPickerBreakId = uVar46;
      pIVar64->DebugItemPickerActive = false;
    }
    pIVar2 = &pIVar20->NextWindowData;
    *(byte *)&pIVar2->Flags = (byte)pIVar2->Flags | 0x40;
    (pIVar20->NextWindowData).BgAlphaVal = 0.6;
    BeginTooltip();
    Text("HoveredId: 0x%08X",(ulong)uVar46);
    Text("Press ESC to abort picking.");
    TextColored((GImGui->Style).Colors + (uVar46 == 0),"Click to break in debugger!");
    EndTooltip();
    pIVar64 = GImGui;
  }
  pIVar64->DebugHookIdInfo = 0;
  if (pIVar64->FrameCount != (pIVar64->DebugStackTool).LastActiveFrame + 1) goto LAB_00148318;
  IVar47 = pIVar64->HoveredIdPreviousFrame;
  if (IVar47 == 0) {
    IVar47 = pIVar64->ActiveId;
  }
  if ((pIVar64->DebugStackTool).QueryId != IVar47) {
    (pIVar64->DebugStackTool).QueryId = IVar47;
    (pIVar64->DebugStackTool).StackLevel = -1;
    ImVector<ImGuiStackLevelInfo>::resize(&(pIVar64->DebugStackTool).Results,0);
  }
  if (IVar47 == 0) goto LAB_00148318;
  iVar53 = (pIVar64->DebugStackTool).StackLevel;
  if (iVar53 < 0) {
LAB_001482d4:
    if (iVar53 == -1) {
      pIVar64->DebugHookIdInfo = IVar47;
      goto LAB_00148318;
    }
    if (iVar53 < 0) goto LAB_00148318;
    iVar67 = (pIVar64->DebugStackTool).Results.Size;
  }
  else {
    iVar67 = (pIVar64->DebugStackTool).Results.Size;
    if (iVar53 < iVar67) {
      pIVar3 = &(pIVar64->DebugStackTool).Results;
      pIVar45 = ImVector<ImGuiStackLevelInfo>::operator[](pIVar3,iVar53);
      if ((pIVar45->QuerySuccess == false) &&
         (pIVar45 = ImVector<ImGuiStackLevelInfo>::operator[](pIVar3,iVar53),
         pIVar45->QueryFrameCount < '\x03')) {
        iVar53 = (pIVar64->DebugStackTool).StackLevel;
      }
      else {
        iVar53 = (pIVar64->DebugStackTool).StackLevel + 1;
        (pIVar64->DebugStackTool).StackLevel = iVar53;
      }
      goto LAB_001482d4;
    }
  }
  if (iVar53 < iVar67) {
    pIVar3 = &(pIVar64->DebugStackTool).Results;
    pIVar45 = ImVector<ImGuiStackLevelInfo>::operator[](pIVar3,iVar53);
    pIVar64->DebugHookIdInfo = pIVar45->ID;
    pIVar45 = ImVector<ImGuiStackLevelInfo>::operator[](pIVar3,iVar53);
    pIVar45->QueryFrameCount = pIVar45->QueryFrameCount + '\x01';
  }
LAB_00148318:
  pIVar61->WithinFrameScopeWithImplicitWindow = true;
  pIVar64 = GImGui;
  (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 2;
  (pIVar64->NextWindowData).SizeVal.x = 400.0;
  (pIVar64->NextWindowData).SizeVal.y = 400.0;
  (pIVar64->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  if (pIVar61->CurrentWindow->IsFallbackWindow != false) {
    CallContextHooks(pIVar61,ImGuiContextHookType_NewFramePost);
    return;
  }
  __assert_fail("g.CurrentWindow->IsFallbackWindow == true",
                "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                ,0x1217,"void ImGui::NewFrame()");
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

    // Remove pending delete hooks before frame start.
    // This deferred removal avoid issues of removal while iterating the hook vector
    for (int n = g.Hooks.Size - 1; n >= 0; n--)
        if (g.Hooks[n].Type == ImGuiContextHookType_PendingRemoval_)
            g.Hooks.erase(&g.Hooks[n]);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePre);

    // Check and assert for various common IO and Configuration mistakes
    g.ConfigFlagsLastFrame = g.ConfigFlagsCurrFrame;
    ErrorCheckNewFrameSanityChecks();
    g.ConfigFlagsCurrFrame = g.IO.ConfigFlags;

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.FramerateSecPerFrameCount = ImMin(g.FramerateSecPerFrameCount + 1, IM_ARRAYSIZE(g.FramerateSecPerFrame));
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)g.FramerateSecPerFrameCount)) : FLT_MAX;

    UpdateViewportsNewFrame();

    // Setup current font and draw list shared data
    // FIXME-VIEWPORT: the concept of a single ClipRectFullscreen is not ideal!
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    ImRect virtual_space(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    for (int n = 0; n < g.Viewports.Size; n++)
        virtual_space.Add(g.Viewports[n]->GetMainRect());
    g.DrawListSharedData.ClipRectFullscreen = virtual_space.ToVec4();
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleTessellationMaxError(g.Style.CircleTessellationMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedLinesUseTex && !(g.Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines))
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLinesUseTex;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawData = NULL;
        viewport->DrawDataP.Clear();
    }

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredIdPreviousFrameUsingMouseWheel = g.HoveredIdUsingMouseWheel;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    g.HoveredIdUsingMouseWheel = false;
    g.HoveredIdDisabled = false;

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingNavInputMask = 0x00;
        g.ActiveIdUsingKeyInputMask.ClearAllBits();
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Close popups on focus lost (currently wip/opt-in)
    //if (g.IO.AppFocusLost)
    //    ClosePopupsExceptModals();

    // Process input queue (trickle as many events as possible)
    g.InputEventsTrail.resize(0);
    UpdateInputEvents(g.IO.ConfigInputTrickleEventQueue);

    // Update keyboard input state
    UpdateKeyboardInputs();

    //IM_ASSERT(g.IO.KeyCtrl == IsKeyDown(ImGuiKey_LeftCtrl) || IsKeyDown(ImGuiKey_RightCtrl));
    //IM_ASSERT(g.IO.KeyShift == IsKeyDown(ImGuiKey_LeftShift) || IsKeyDown(ImGuiKey_RightShift));
    //IM_ASSERT(g.IO.KeyAlt == IsKeyDown(ImGuiKey_LeftAlt) || IsKeyDown(ImGuiKey_RightAlt));
    //IM_ASSERT(g.IO.KeySuper == IsKeyDown(ImGuiKey_LeftSuper) || IsKeyDown(ImGuiKey_RightSuper));

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Undocking
    // (needs to be before UpdateMouseMovingWindowNewFrame so the window is already offset and following the mouse on the detaching frame)
    DockContextNewFrameUpdateUndocking(&g);

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;

    // Platform IME data: reset for the frame
    g.PlatformImeDataPrev = g.PlatformImeData;
    g.PlatformImeData.WantVisible = false;

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size <= g.Windows.Size);
    const float memory_compact_start_time = (g.GcCompactAll || g.IO.ConfigMemoryCompactTimer < 0.0f) ? FLT_MAX : (float)g.Time - g.IO.ConfigMemoryCompactTimer;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Garbage collect transient buffers of recently unused tables
    for (int i = 0; i < g.TablesLastTimeActive.Size; i++)
        if (g.TablesLastTimeActive[i] >= 0.0f && g.TablesLastTimeActive[i] < memory_compact_start_time)
            TableGcCompactTransientBuffers(g.Tables.GetByIndex(i));
    for (int i = 0; i < g.TablesTempData.Size; i++)
        if (g.TablesTempData[i].LastTimeActive >= 0.0f && g.TablesTempData[i].LastTimeActive < memory_compact_start_time)
            TableGcCompactTransientBuffers(&g.TablesTempData[i]);
    if (g.GcCompactAll)
        GcCompactTransientMiscBuffers();
    g.GcCompactAll = false;

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    g.ItemFlagsStack.resize(0);
    g.ItemFlagsStack.push_back(ImGuiItemFlags_None);
    g.GroupStack.resize(0);

    // Docking
    DockContextNewFrameUpdateDocking(&g);

    // [DEBUG] Update debug features
    UpdateDebugToolItemPicker();
    UpdateDebugToolStackQueries();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400, 400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePost);
}